

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_hn<embree::sse2::OrientedCurve1Intersector1<embree::HermiteCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Primitive PVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  __int_type_conflict _Var15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined3 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined6 uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  byte bVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  RTCFilterFunctionN p_Var59;
  int iVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  bool bVar65;
  uint uVar66;
  uint uVar67;
  int iVar68;
  uint uVar69;
  uint uVar70;
  short sVar71;
  float t1;
  undefined2 uVar100;
  float fVar72;
  float fVar101;
  float fVar102;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar103;
  float fVar122;
  float fVar123;
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar124;
  float fVar141;
  float fVar142;
  vfloat4 v;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar143;
  float fVar159;
  float fVar160;
  vfloat4 v_1;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar164;
  float fVar165;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar166;
  float fVar189;
  float fVar190;
  vfloat_impl<4> p00;
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar191;
  float fVar201;
  float fVar202;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar203;
  float fVar212;
  float fVar213;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar215;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar254;
  float fVar257;
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  float fVar255;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar273;
  float fVar276;
  vfloat4 a;
  undefined1 auVar265 [16];
  undefined1 auVar268 [16];
  float fVar274;
  float fVar275;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar292;
  float fVar295;
  vfloat4 a_2;
  float fVar298;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [16];
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar297;
  float fVar299;
  float fVar300;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar301;
  float fVar302;
  float fVar311;
  float fVar313;
  float fVar315;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar307 [16];
  float fVar312;
  float fVar314;
  float fVar316;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar317;
  float fVar318;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar333;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_43d;
  uint local_43c;
  float fStack_430;
  float fStack_42c;
  undefined8 local_428;
  undefined4 local_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  ulong local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  ulong local_300;
  Primitive *local_2f8;
  long local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint auStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 uVar99;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar157 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  
  PVar10 = prim[1];
  uVar55 = (ulong)(byte)PVar10;
  lVar18 = uVar55 * 0x25;
  pPVar4 = prim + lVar18 + 6;
  fVar142 = *(float *)(pPVar4 + 0xc);
  fVar143 = ((ray->org).field_0.m128[0] - *(float *)pPVar4) * fVar142;
  fVar159 = ((ray->org).field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar142;
  fVar160 = ((ray->org).field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar142;
  fVar124 = fVar142 * (ray->dir).field_0.m128[0];
  fVar141 = fVar142 * (ray->dir).field_0.m128[1];
  fVar142 = fVar142 * (ray->dir).field_0.m128[2];
  uVar11 = *(undefined4 *)(prim + uVar55 * 4 + 6);
  uVar99 = (undefined1)((uint)uVar11 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar11 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar11));
  uVar99 = (undefined1)((uint)uVar11 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar11,(char)uVar11);
  uVar62 = CONCAT62(uVar31,sVar71);
  auVar117._8_4_ = 0;
  auVar117._0_8_ = uVar62;
  auVar117._12_2_ = uVar100;
  auVar117._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar126._12_4_ = auVar117._12_4_;
  auVar126._8_2_ = 0;
  auVar126._0_8_ = uVar62;
  auVar126._10_2_ = uVar100;
  auVar73._10_6_ = auVar126._10_6_;
  auVar73._8_2_ = uVar100;
  auVar73._0_8_ = uVar62;
  uVar100 = (undefined2)uVar31;
  auVar32._4_8_ = auVar73._8_8_;
  auVar32._2_2_ = uVar100;
  auVar32._0_2_ = uVar100;
  fVar317 = (float)((int)sVar71 >> 8);
  fVar322 = (float)(auVar32._0_4_ >> 0x18);
  fVar323 = (float)(auVar73._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar55 * 5 + 6);
  uVar99 = (undefined1)((uint)uVar11 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar11 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar11));
  uVar99 = (undefined1)((uint)uVar11 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar11,(char)uVar11);
  uVar62 = CONCAT62(uVar31,sVar71);
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar62;
  auVar106._12_2_ = uVar100;
  auVar106._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_2_ = 0;
  auVar105._0_8_ = uVar62;
  auVar105._10_2_ = uVar100;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = uVar100;
  auVar104._0_8_ = uVar62;
  uVar100 = (undefined2)uVar31;
  auVar33._4_8_ = auVar104._8_8_;
  auVar33._2_2_ = uVar100;
  auVar33._0_2_ = uVar100;
  fVar161 = (float)((int)sVar71 >> 8);
  fVar164 = (float)(auVar33._0_4_ >> 0x18);
  fVar165 = (float)(auVar104._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar55 * 6 + 6);
  uVar99 = (undefined1)((uint)uVar11 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar11 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar11));
  uVar99 = (undefined1)((uint)uVar11 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar11,(char)uVar11);
  uVar62 = CONCAT62(uVar31,sVar71);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar62;
  auVar109._12_2_ = uVar100;
  auVar109._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar62;
  auVar108._10_2_ = uVar100;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar100;
  auVar107._0_8_ = uVar62;
  uVar100 = (undefined2)uVar31;
  auVar34._4_8_ = auVar107._8_8_;
  auVar34._2_2_ = uVar100;
  auVar34._0_2_ = uVar100;
  fVar191 = (float)((int)sVar71 >> 8);
  fVar201 = (float)(auVar34._0_4_ >> 0x18);
  fVar202 = (float)(auVar107._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar55 * 0xf + 6);
  uVar99 = (undefined1)((uint)uVar11 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar11 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar11));
  uVar99 = (undefined1)((uint)uVar11 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar11,(char)uVar11);
  uVar62 = CONCAT62(uVar31,sVar71);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar62;
  auVar112._12_2_ = uVar100;
  auVar112._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar62;
  auVar111._10_2_ = uVar100;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar100;
  auVar110._0_8_ = uVar62;
  uVar100 = (undefined2)uVar31;
  auVar35._4_8_ = auVar110._8_8_;
  auVar35._2_2_ = uVar100;
  auVar35._0_2_ = uVar100;
  fVar72 = (float)((int)sVar71 >> 8);
  fVar101 = (float)(auVar35._0_4_ >> 0x18);
  fVar102 = (float)(auVar110._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  uVar99 = (undefined1)((uint)uVar11 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar11 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar11));
  uVar99 = (undefined1)((uint)uVar11 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar11,(char)uVar11);
  uVar62 = CONCAT62(uVar31,sVar71);
  auVar169._8_4_ = 0;
  auVar169._0_8_ = uVar62;
  auVar169._12_2_ = uVar100;
  auVar169._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._8_2_ = 0;
  auVar168._0_8_ = uVar62;
  auVar168._10_2_ = uVar100;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._8_2_ = uVar100;
  auVar167._0_8_ = uVar62;
  uVar100 = (undefined2)uVar31;
  auVar36._4_8_ = auVar167._8_8_;
  auVar36._2_2_ = uVar100;
  auVar36._0_2_ = uVar100;
  fVar203 = (float)((int)sVar71 >> 8);
  fVar212 = (float)(auVar36._0_4_ >> 0x18);
  fVar213 = (float)(auVar167._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar55 + 6);
  uVar99 = (undefined1)((uint)uVar11 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar11 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar11));
  uVar99 = (undefined1)((uint)uVar11 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar11,(char)uVar11);
  uVar62 = CONCAT62(uVar31,sVar71);
  auVar172._8_4_ = 0;
  auVar172._0_8_ = uVar62;
  auVar172._12_2_ = uVar100;
  auVar172._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar62;
  auVar171._10_2_ = uVar100;
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._8_2_ = uVar100;
  auVar170._0_8_ = uVar62;
  uVar100 = (undefined2)uVar31;
  auVar37._4_8_ = auVar170._8_8_;
  auVar37._2_2_ = uVar100;
  auVar37._0_2_ = uVar100;
  fVar241 = (float)((int)sVar71 >> 8);
  fVar254 = (float)(auVar37._0_4_ >> 0x18);
  fVar257 = (float)(auVar170._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar55 * 0x1a + 6);
  uVar99 = (undefined1)((uint)uVar11 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar11 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar11));
  uVar99 = (undefined1)((uint)uVar11 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar11,(char)uVar11);
  uVar62 = CONCAT62(uVar31,sVar71);
  auVar175._8_4_ = 0;
  auVar175._0_8_ = uVar62;
  auVar175._12_2_ = uVar100;
  auVar175._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar62;
  auVar174._10_2_ = uVar100;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._8_2_ = uVar100;
  auVar173._0_8_ = uVar62;
  uVar100 = (undefined2)uVar31;
  auVar38._4_8_ = auVar173._8_8_;
  auVar38._2_2_ = uVar100;
  auVar38._0_2_ = uVar100;
  fVar214 = (float)((int)sVar71 >> 8);
  fVar225 = (float)(auVar38._0_4_ >> 0x18);
  fVar230 = (float)(auVar173._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar55 * 0x1b + 6);
  uVar99 = (undefined1)((uint)uVar11 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar11 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar11));
  uVar99 = (undefined1)((uint)uVar11 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar11,(char)uVar11);
  uVar62 = CONCAT62(uVar31,sVar71);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar62;
  auVar178._12_2_ = uVar100;
  auVar178._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar62;
  auVar177._10_2_ = uVar100;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar100;
  auVar176._0_8_ = uVar62;
  uVar100 = (undefined2)uVar31;
  auVar39._4_8_ = auVar176._8_8_;
  auVar39._2_2_ = uVar100;
  auVar39._0_2_ = uVar100;
  fVar262 = (float)((int)sVar71 >> 8);
  fVar273 = (float)(auVar39._0_4_ >> 0x18);
  fVar276 = (float)(auVar176._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar55 * 0x1c + 6);
  uVar99 = (undefined1)((uint)uVar11 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar11 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar11));
  uVar99 = (undefined1)((uint)uVar11 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar99),uVar99);
  sVar71 = CONCAT11((char)uVar11,(char)uVar11);
  uVar62 = CONCAT62(uVar31,sVar71);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar62;
  auVar181._12_2_ = uVar100;
  auVar181._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar62;
  auVar180._10_2_ = uVar100;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar100;
  auVar179._0_8_ = uVar62;
  uVar100 = (undefined2)uVar31;
  auVar40._4_8_ = auVar179._8_8_;
  auVar40._2_2_ = uVar100;
  auVar40._0_2_ = uVar100;
  fVar103 = (float)((int)sVar71 >> 8);
  fVar122 = (float)(auVar40._0_4_ >> 0x18);
  fVar123 = (float)(auVar179._8_4_ >> 0x18);
  fVar301 = fVar124 * fVar317 + fVar141 * fVar161 + fVar142 * fVar191;
  fVar311 = fVar124 * fVar322 + fVar141 * fVar164 + fVar142 * fVar201;
  fVar313 = fVar124 * fVar323 + fVar141 * fVar165 + fVar142 * fVar202;
  fVar315 = fVar124 * (float)(auVar126._12_4_ >> 0x18) +
            fVar141 * (float)(auVar105._12_4_ >> 0x18) + fVar142 * (float)(auVar108._12_4_ >> 0x18);
  fVar281 = fVar124 * fVar72 + fVar141 * fVar203 + fVar142 * fVar241;
  fVar292 = fVar124 * fVar101 + fVar141 * fVar212 + fVar142 * fVar254;
  fVar295 = fVar124 * fVar102 + fVar141 * fVar213 + fVar142 * fVar257;
  fVar298 = fVar124 * (float)(auVar111._12_4_ >> 0x18) +
            fVar141 * (float)(auVar168._12_4_ >> 0x18) + fVar142 * (float)(auVar171._12_4_ >> 0x18);
  fVar166 = fVar124 * fVar214 + fVar141 * fVar262 + fVar142 * fVar103;
  fVar189 = fVar124 * fVar225 + fVar141 * fVar273 + fVar142 * fVar122;
  fVar190 = fVar124 * fVar230 + fVar141 * fVar276 + fVar142 * fVar123;
  fVar124 = fVar124 * (float)(auVar174._12_4_ >> 0x18) +
            fVar141 * (float)(auVar177._12_4_ >> 0x18) + fVar142 * (float)(auVar180._12_4_ >> 0x18);
  fVar318 = fVar317 * fVar143 + fVar161 * fVar159 + fVar191 * fVar160;
  fVar322 = fVar322 * fVar143 + fVar164 * fVar159 + fVar201 * fVar160;
  fVar323 = fVar323 * fVar143 + fVar165 * fVar159 + fVar202 * fVar160;
  fVar324 = (float)(auVar126._12_4_ >> 0x18) * fVar143 +
            (float)(auVar105._12_4_ >> 0x18) * fVar159 + (float)(auVar108._12_4_ >> 0x18) * fVar160;
  fVar241 = fVar72 * fVar143 + fVar203 * fVar159 + fVar241 * fVar160;
  fVar254 = fVar101 * fVar143 + fVar212 * fVar159 + fVar254 * fVar160;
  fVar257 = fVar102 * fVar143 + fVar213 * fVar159 + fVar257 * fVar160;
  fVar317 = (float)(auVar111._12_4_ >> 0x18) * fVar143 +
            (float)(auVar168._12_4_ >> 0x18) * fVar159 + (float)(auVar171._12_4_ >> 0x18) * fVar160;
  fVar214 = fVar143 * fVar214 + fVar159 * fVar262 + fVar160 * fVar103;
  fVar225 = fVar143 * fVar225 + fVar159 * fVar273 + fVar160 * fVar122;
  fVar230 = fVar143 * fVar230 + fVar159 * fVar276 + fVar160 * fVar123;
  fVar262 = fVar143 * (float)(auVar174._12_4_ >> 0x18) +
            fVar159 * (float)(auVar177._12_4_ >> 0x18) + fVar160 * (float)(auVar180._12_4_ >> 0x18);
  fVar142 = (float)DAT_01ff1d40;
  fVar72 = DAT_01ff1d40._4_4_;
  fVar101 = DAT_01ff1d40._8_4_;
  fVar102 = DAT_01ff1d40._12_4_;
  uVar66 = -(uint)(fVar142 <= ABS(fVar301));
  uVar67 = -(uint)(fVar72 <= ABS(fVar311));
  uVar69 = -(uint)(fVar101 <= ABS(fVar313));
  uVar70 = -(uint)(fVar102 <= ABS(fVar315));
  auVar303._0_4_ = (uint)fVar301 & uVar66;
  auVar303._4_4_ = (uint)fVar311 & uVar67;
  auVar303._8_4_ = (uint)fVar313 & uVar69;
  auVar303._12_4_ = (uint)fVar315 & uVar70;
  auVar144._0_4_ = ~uVar66 & (uint)fVar142;
  auVar144._4_4_ = ~uVar67 & (uint)fVar72;
  auVar144._8_4_ = ~uVar69 & (uint)fVar101;
  auVar144._12_4_ = ~uVar70 & (uint)fVar102;
  auVar144 = auVar144 | auVar303;
  uVar66 = -(uint)(fVar142 <= ABS(fVar281));
  uVar67 = -(uint)(fVar72 <= ABS(fVar292));
  uVar69 = -(uint)(fVar101 <= ABS(fVar295));
  uVar70 = -(uint)(fVar102 <= ABS(fVar298));
  auVar284._0_4_ = (uint)fVar281 & uVar66;
  auVar284._4_4_ = (uint)fVar292 & uVar67;
  auVar284._8_4_ = (uint)fVar295 & uVar69;
  auVar284._12_4_ = (uint)fVar298 & uVar70;
  auVar192._0_4_ = ~uVar66 & (uint)fVar142;
  auVar192._4_4_ = ~uVar67 & (uint)fVar72;
  auVar192._8_4_ = ~uVar69 & (uint)fVar101;
  auVar192._12_4_ = ~uVar70 & (uint)fVar102;
  auVar192 = auVar192 | auVar284;
  uVar66 = -(uint)(fVar142 <= ABS(fVar166));
  uVar67 = -(uint)(fVar72 <= ABS(fVar189));
  uVar69 = -(uint)(fVar101 <= ABS(fVar190));
  uVar70 = -(uint)(fVar102 <= ABS(fVar124));
  auVar182._0_4_ = (uint)fVar166 & uVar66;
  auVar182._4_4_ = (uint)fVar189 & uVar67;
  auVar182._8_4_ = (uint)fVar190 & uVar69;
  auVar182._12_4_ = (uint)fVar124 & uVar70;
  auVar204._0_4_ = ~uVar66 & (uint)fVar142;
  auVar204._4_4_ = ~uVar67 & (uint)fVar72;
  auVar204._8_4_ = ~uVar69 & (uint)fVar101;
  auVar204._12_4_ = ~uVar70 & (uint)fVar102;
  auVar204 = auVar204 | auVar182;
  auVar73 = rcpps(_DAT_01ff1d40,auVar144);
  fVar142 = auVar73._0_4_;
  fVar102 = auVar73._4_4_;
  fVar161 = auVar73._8_4_;
  fVar203 = auVar73._12_4_;
  fVar142 = (1.0 - auVar144._0_4_ * fVar142) * fVar142 + fVar142;
  fVar102 = (1.0 - auVar144._4_4_ * fVar102) * fVar102 + fVar102;
  fVar161 = (1.0 - auVar144._8_4_ * fVar161) * fVar161 + fVar161;
  fVar203 = (1.0 - auVar144._12_4_ * fVar203) * fVar203 + fVar203;
  auVar73 = rcpps(auVar73,auVar192);
  fVar72 = auVar73._0_4_;
  fVar103 = auVar73._4_4_;
  fVar164 = auVar73._8_4_;
  fVar212 = auVar73._12_4_;
  fVar72 = (1.0 - auVar192._0_4_ * fVar72) * fVar72 + fVar72;
  fVar103 = (1.0 - auVar192._4_4_ * fVar103) * fVar103 + fVar103;
  fVar164 = (1.0 - auVar192._8_4_ * fVar164) * fVar164 + fVar164;
  fVar212 = (1.0 - auVar192._12_4_ * fVar212) * fVar212 + fVar212;
  auVar73 = rcpps(auVar73,auVar204);
  fVar101 = auVar73._0_4_;
  fVar122 = auVar73._4_4_;
  fVar165 = auVar73._8_4_;
  fVar213 = auVar73._12_4_;
  fVar101 = (1.0 - auVar204._0_4_ * fVar101) * fVar101 + fVar101;
  fVar122 = (1.0 - auVar204._4_4_ * fVar122) * fVar122 + fVar122;
  fVar165 = (1.0 - auVar204._8_4_ * fVar165) * fVar165 + fVar165;
  fVar213 = (1.0 - auVar204._12_4_ * fVar213) * fVar213 + fVar213;
  fVar273 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar18 + 0x16)) *
            *(float *)(prim + lVar18 + 0x1a);
  uVar62 = *(ulong *)(prim + uVar55 * 7 + 6);
  uVar100 = (undefined2)(uVar62 >> 0x30);
  auVar128._8_4_ = 0;
  auVar128._0_8_ = uVar62;
  auVar128._12_2_ = uVar100;
  auVar128._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar62 >> 0x20);
  auVar326._12_4_ = auVar128._12_4_;
  auVar326._8_2_ = 0;
  auVar326._0_8_ = uVar62;
  auVar326._10_2_ = uVar100;
  auVar74._10_6_ = auVar326._10_6_;
  auVar74._8_2_ = uVar100;
  auVar74._0_8_ = uVar62;
  uVar100 = (undefined2)(uVar62 >> 0x10);
  auVar41._4_8_ = auVar74._8_8_;
  auVar41._2_2_ = uVar100;
  auVar41._0_2_ = uVar100;
  fVar123 = (float)(auVar41._0_4_ >> 0x10);
  fVar166 = (float)(auVar74._8_4_ >> 0x10);
  uVar56 = *(ulong *)(prim + uVar55 * 0xb + 6);
  uVar100 = (undefined2)(uVar56 >> 0x30);
  auVar147._8_4_ = 0;
  auVar147._0_8_ = uVar56;
  auVar147._12_2_ = uVar100;
  auVar147._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar56 >> 0x20);
  auVar146._12_4_ = auVar147._12_4_;
  auVar146._8_2_ = 0;
  auVar146._0_8_ = uVar56;
  auVar146._10_2_ = uVar100;
  auVar145._10_6_ = auVar146._10_6_;
  auVar145._8_2_ = uVar100;
  auVar145._0_8_ = uVar56;
  uVar100 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar145._8_8_;
  auVar42._2_2_ = uVar100;
  auVar42._0_2_ = uVar100;
  uVar57 = *(ulong *)(prim + uVar55 * 9 + 6);
  uVar100 = (undefined2)(uVar57 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar57;
  auVar77._12_2_ = uVar100;
  auVar77._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar57 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar57;
  auVar76._10_2_ = uVar100;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar100;
  auVar75._0_8_ = uVar57;
  uVar100 = (undefined2)(uVar57 >> 0x10);
  auVar43._4_8_ = auVar75._8_8_;
  auVar43._2_2_ = uVar100;
  auVar43._0_2_ = uVar100;
  fVar124 = (float)(auVar43._0_4_ >> 0x10);
  fVar189 = (float)(auVar75._8_4_ >> 0x10);
  uVar58 = *(ulong *)(prim + uVar55 * 0xd + 6);
  uVar100 = (undefined2)(uVar58 >> 0x30);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar58;
  auVar207._12_2_ = uVar100;
  auVar207._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar58 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar58;
  auVar206._10_2_ = uVar100;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar100;
  auVar205._0_8_ = uVar58;
  uVar100 = (undefined2)(uVar58 >> 0x10);
  auVar44._4_8_ = auVar205._8_8_;
  auVar44._2_2_ = uVar100;
  auVar44._0_2_ = uVar100;
  uVar61 = *(ulong *)(prim + uVar55 * 0x12 + 6);
  uVar100 = (undefined2)(uVar61 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar61;
  auVar80._12_2_ = uVar100;
  auVar80._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar61 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar61;
  auVar79._10_2_ = uVar100;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar100;
  auVar78._0_8_ = uVar61;
  uVar100 = (undefined2)(uVar61 >> 0x10);
  auVar45._4_8_ = auVar78._8_8_;
  auVar45._2_2_ = uVar100;
  auVar45._0_2_ = uVar100;
  fVar141 = (float)(auVar45._0_4_ >> 0x10);
  fVar190 = (float)(auVar78._8_4_ >> 0x10);
  uVar64 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  uVar5 = *(ulong *)(prim + uVar55 * 2 + uVar64 + 6);
  uVar100 = (undefined2)(uVar5 >> 0x30);
  auVar246._8_4_ = 0;
  auVar246._0_8_ = uVar5;
  auVar246._12_2_ = uVar100;
  auVar246._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar5 >> 0x20);
  auVar245._12_4_ = auVar246._12_4_;
  auVar245._8_2_ = 0;
  auVar245._0_8_ = uVar5;
  auVar245._10_2_ = uVar100;
  auVar244._10_6_ = auVar245._10_6_;
  auVar244._8_2_ = uVar100;
  auVar244._0_8_ = uVar5;
  uVar100 = (undefined2)(uVar5 >> 0x10);
  auVar46._4_8_ = auVar244._8_8_;
  auVar46._2_2_ = uVar100;
  auVar46._0_2_ = uVar100;
  uVar64 = *(ulong *)(prim + uVar64 + 6);
  uVar100 = (undefined2)(uVar64 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar64;
  auVar83._12_2_ = uVar100;
  auVar83._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar64 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar64;
  auVar82._10_2_ = uVar100;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar100;
  auVar81._0_8_ = uVar64;
  uVar100 = (undefined2)(uVar64 >> 0x10);
  auVar47._4_8_ = auVar81._8_8_;
  auVar47._2_2_ = uVar100;
  auVar47._0_2_ = uVar100;
  fVar143 = (float)(auVar47._0_4_ >> 0x10);
  fVar191 = (float)(auVar81._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar55 * 0x18 + 6);
  uVar100 = (undefined2)(uVar6 >> 0x30);
  auVar267._8_4_ = 0;
  auVar267._0_8_ = uVar6;
  auVar267._12_2_ = uVar100;
  auVar267._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar6 >> 0x20);
  auVar266._12_4_ = auVar267._12_4_;
  auVar266._8_2_ = 0;
  auVar266._0_8_ = uVar6;
  auVar266._10_2_ = uVar100;
  auVar265._10_6_ = auVar266._10_6_;
  auVar265._8_2_ = uVar100;
  auVar265._0_8_ = uVar6;
  uVar100 = (undefined2)(uVar6 >> 0x10);
  auVar48._4_8_ = auVar265._8_8_;
  auVar48._2_2_ = uVar100;
  auVar48._0_2_ = uVar100;
  uVar7 = *(ulong *)(prim + uVar55 * 0x1d + 6);
  uVar100 = (undefined2)(uVar7 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar7;
  auVar86._12_2_ = uVar100;
  auVar86._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar7 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar7;
  auVar85._10_2_ = uVar100;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar100;
  auVar84._0_8_ = uVar7;
  uVar100 = (undefined2)(uVar7 >> 0x10);
  auVar49._4_8_ = auVar84._8_8_;
  auVar49._2_2_ = uVar100;
  auVar49._0_2_ = uVar100;
  fVar159 = (float)(auVar49._0_4_ >> 0x10);
  fVar201 = (float)(auVar84._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar55 + (ulong)(byte)PVar10 * 0x20 + 6);
  uVar100 = (undefined2)(uVar8 >> 0x30);
  auVar287._8_4_ = 0;
  auVar287._0_8_ = uVar8;
  auVar287._12_2_ = uVar100;
  auVar287._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar8 >> 0x20);
  auVar286._12_4_ = auVar287._12_4_;
  auVar286._8_2_ = 0;
  auVar286._0_8_ = uVar8;
  auVar286._10_2_ = uVar100;
  auVar285._10_6_ = auVar286._10_6_;
  auVar285._8_2_ = uVar100;
  auVar285._0_8_ = uVar8;
  uVar100 = (undefined2)(uVar8 >> 0x10);
  auVar50._4_8_ = auVar285._8_8_;
  auVar50._2_2_ = uVar100;
  auVar50._0_2_ = uVar100;
  uVar9 = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar55) + 6);
  uVar100 = (undefined2)(uVar9 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar9;
  auVar89._12_2_ = uVar100;
  auVar89._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar9 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar9;
  auVar88._10_2_ = uVar100;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar100;
  auVar87._0_8_ = uVar9;
  uVar100 = (undefined2)(uVar9 >> 0x10);
  auVar51._4_8_ = auVar87._8_8_;
  auVar51._2_2_ = uVar100;
  auVar51._0_2_ = uVar100;
  fVar160 = (float)(auVar51._0_4_ >> 0x10);
  fVar202 = (float)(auVar87._8_4_ >> 0x10);
  uVar55 = *(ulong *)(prim + uVar55 * 0x23 + 6);
  uVar100 = (undefined2)(uVar55 >> 0x30);
  auVar306._8_4_ = 0;
  auVar306._0_8_ = uVar55;
  auVar306._12_2_ = uVar100;
  auVar306._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar55 >> 0x20);
  auVar305._12_4_ = auVar306._12_4_;
  auVar305._8_2_ = 0;
  auVar305._0_8_ = uVar55;
  auVar305._10_2_ = uVar100;
  auVar304._10_6_ = auVar305._10_6_;
  auVar304._8_2_ = uVar100;
  auVar304._0_8_ = uVar55;
  uVar100 = (undefined2)(uVar55 >> 0x10);
  auVar52._4_8_ = auVar304._8_8_;
  auVar52._2_2_ = uVar100;
  auVar52._0_2_ = uVar100;
  auVar148._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar123) * fVar273 + fVar123) - fVar322) *
                fVar102,((((float)(int)(short)uVar56 - (float)(int)(short)uVar62) * fVar273 +
                         (float)(int)(short)uVar62) - fVar318) * fVar142);
  auVar148._8_4_ =
       ((((float)(auVar145._8_4_ >> 0x10) - fVar166) * fVar273 + fVar166) - fVar323) * fVar161;
  auVar148._12_4_ =
       ((((float)(auVar146._12_4_ >> 0x10) - (float)(auVar326._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar326._12_4_ >> 0x10)) - fVar324) * fVar203;
  auVar208._0_4_ =
       ((((float)(int)(short)uVar58 - (float)(int)(short)uVar57) * fVar273 +
        (float)(int)(short)uVar57) - fVar318) * fVar142;
  auVar208._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar124) * fVar273 + fVar124) - fVar322) * fVar102;
  auVar208._8_4_ =
       ((((float)(auVar205._8_4_ >> 0x10) - fVar189) * fVar273 + fVar189) - fVar323) * fVar161;
  auVar208._12_4_ =
       ((((float)(auVar206._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar324) * fVar203;
  auVar247._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar141) * fVar273 + fVar141) - fVar254) *
                fVar103,((((float)(int)(short)uVar5 - (float)(int)(short)uVar61) * fVar273 +
                         (float)(int)(short)uVar61) - fVar241) * fVar72);
  auVar247._8_4_ =
       ((((float)(auVar244._8_4_ >> 0x10) - fVar190) * fVar273 + fVar190) - fVar257) * fVar164;
  auVar247._12_4_ =
       ((((float)(auVar245._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar317) * fVar212;
  auVar268._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar64) * fVar273 +
        (float)(int)(short)uVar64) - fVar241) * fVar72;
  auVar268._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar143) * fVar273 + fVar143) - fVar254) * fVar103;
  auVar268._8_4_ =
       ((((float)(auVar265._8_4_ >> 0x10) - fVar191) * fVar273 + fVar191) - fVar257) * fVar164;
  auVar268._12_4_ =
       ((((float)(auVar266._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar317) * fVar212;
  auVar288._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar159) * fVar273 + fVar159) - fVar225) *
                fVar122,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar273 +
                         (float)(int)(short)uVar7) - fVar214) * fVar101);
  auVar288._8_4_ =
       ((((float)(auVar285._8_4_ >> 0x10) - fVar201) * fVar273 + fVar201) - fVar230) * fVar165;
  auVar288._12_4_ =
       ((((float)(auVar286._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar262) * fVar213;
  auVar307._0_4_ =
       ((((float)(int)(short)uVar55 - (float)(int)(short)uVar9) * fVar273 + (float)(int)(short)uVar9
        ) - fVar214) * fVar101;
  auVar307._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar160) * fVar273 + fVar160) - fVar225) * fVar122;
  auVar307._8_4_ =
       ((((float)(auVar304._8_4_ >> 0x10) - fVar202) * fVar273 + fVar202) - fVar230) * fVar165;
  auVar307._12_4_ =
       ((((float)(auVar305._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar262) * fVar213;
  auVar125._8_4_ = auVar148._8_4_;
  auVar125._0_8_ = auVar148._0_8_;
  auVar125._12_4_ = auVar148._12_4_;
  auVar126 = minps(auVar125,auVar208);
  auVar90._8_4_ = auVar247._8_4_;
  auVar90._0_8_ = auVar247._0_8_;
  auVar90._12_4_ = auVar247._12_4_;
  auVar73 = minps(auVar90,auVar268);
  auVar126 = maxps(auVar126,auVar73);
  auVar91._8_4_ = auVar288._8_4_;
  auVar91._0_8_ = auVar288._0_8_;
  auVar91._12_4_ = auVar288._12_4_;
  auVar73 = minps(auVar91,auVar307);
  uVar11 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar113._4_4_ = uVar11;
  auVar113._0_4_ = uVar11;
  auVar113._8_4_ = uVar11;
  auVar113._12_4_ = uVar11;
  auVar73 = maxps(auVar73,auVar113);
  auVar73 = maxps(auVar126,auVar73);
  local_178 = auVar73._0_4_ * 0.99999964;
  fStack_174 = auVar73._4_4_ * 0.99999964;
  fStack_170 = auVar73._8_4_ * 0.99999964;
  fStack_16c = auVar73._12_4_ * 0.99999964;
  auVar73 = maxps(auVar148,auVar208);
  auVar126 = maxps(auVar247,auVar268);
  auVar73 = minps(auVar73,auVar126);
  auVar126 = maxps(auVar288,auVar307);
  fVar142 = ray->tfar;
  auVar92._4_4_ = fVar142;
  auVar92._0_4_ = fVar142;
  auVar92._8_4_ = fVar142;
  auVar92._12_4_ = fVar142;
  auVar126 = minps(auVar126,auVar92);
  auVar73 = minps(auVar73,auVar126);
  uVar66 = (uint)(byte)PVar10;
  auVar114._0_4_ = -(uint)(uVar66 != 0 && local_178 <= auVar73._0_4_ * 1.0000004);
  auVar114._4_4_ = -(uint)(1 < uVar66 && fStack_174 <= auVar73._4_4_ * 1.0000004);
  auVar114._8_4_ = -(uint)(2 < uVar66 && fStack_170 <= auVar73._8_4_ * 1.0000004);
  auVar114._12_4_ = -(uint)(3 < uVar66 && fStack_16c <= auVar73._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar114);
  local_43d = uVar66 != 0;
  if (uVar66 == 0) {
    return local_43d;
  }
  uVar66 = uVar66 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_2f8 = prim;
LAB_00c12940:
  lVar18 = 0;
  if ((ulong)uVar66 != 0) {
    for (; (uVar66 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
    }
  }
  local_370 = (ulong)*(uint *)(local_2f8 + 2);
  uVar67 = *(uint *)(local_2f8 + lVar18 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[local_370].ptr;
  fVar142 = pGVar12->fnumTimeSegments;
  fVar72 = (pGVar12->time_range).lower;
  fVar101 = (((ray->dir).field_0.m128[3] - fVar72) / ((pGVar12->time_range).upper - fVar72)) *
            fVar142;
  fVar72 = floorf(fVar101);
  fVar142 = fVar142 + -1.0;
  if (fVar142 <= fVar72) {
    fVar72 = fVar142;
  }
  fVar142 = 0.0;
  if (0.0 <= fVar72) {
    fVar142 = fVar72;
  }
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)uVar67 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar63 = (long)(int)fVar142 * 0x38;
  lVar18 = *(long *)(_Var13 + 0x10 + lVar63);
  pfVar1 = (float *)(*(long *)(_Var13 + lVar63) + lVar18 * uVar56);
  fVar72 = *pfVar1;
  fVar102 = pfVar1[1];
  fVar103 = pfVar1[2];
  fVar122 = pfVar1[3];
  uVar62 = uVar56 + 1;
  pfVar1 = (float *)(*(long *)(_Var13 + lVar63) + lVar18 * uVar62);
  fVar123 = *pfVar1;
  fVar124 = pfVar1[1];
  fVar141 = pfVar1[2];
  fVar143 = pfVar1[3];
  p_Var59 = pGVar12[4].occlusionFilterN;
  lVar18 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar14 = *(long *)(lVar18 + 0x10 + lVar63);
  pfVar1 = (float *)(*(long *)(lVar18 + lVar63) + lVar14 * uVar56);
  fVar159 = *pfVar1;
  fVar160 = pfVar1[1];
  fVar161 = pfVar1[2];
  fVar164 = pfVar1[3];
  pfVar1 = (float *)(*(long *)(lVar18 + lVar63) + lVar14 * uVar62);
  fVar165 = *pfVar1;
  fVar166 = pfVar1[1];
  fVar189 = pfVar1[2];
  fVar190 = pfVar1[3];
  _Var15 = pGVar12[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar14 = *(long *)(_Var15 + 0x10 + lVar63);
  pfVar1 = (float *)(*(long *)(_Var15 + lVar63) + lVar14 * uVar56);
  pfVar2 = (float *)(*(long *)(_Var15 + lVar63) + lVar14 * uVar62);
  pfVar3 = (float *)(*(long *)(p_Var59 + lVar63) + *(long *)(p_Var59 + lVar63 + 0x10) * uVar56);
  fVar101 = fVar101 - fVar142;
  fVar142 = *pfVar3 * 0.33333334 + fVar72;
  fVar191 = pfVar3[1] * 0.33333334 + fVar102;
  fVar201 = pfVar3[2] * 0.33333334 + fVar103;
  fVar202 = pfVar3[3] * 0.33333334 + fVar122;
  pfVar3 = (float *)(*(long *)(p_Var59 + lVar63) + *(long *)(p_Var59 + lVar63 + 0x10) * uVar62);
  fVar214 = fVar123 - *pfVar3 * 0.33333334;
  fVar273 = fVar124 - pfVar3[1] * 0.33333334;
  fVar292 = fVar141 - pfVar3[2] * 0.33333334;
  fVar298 = fVar143 - pfVar3[3] * 0.33333334;
  fVar241 = *pfVar1 * 0.33333334 + fVar159;
  fVar276 = pfVar1[1] * 0.33333334 + fVar160;
  fVar315 = pfVar1[2] * 0.33333334 + fVar161;
  fVar318 = pfVar1[3] * 0.33333334 + fVar164;
  fVar322 = fVar165 - *pfVar2 * 0.33333334;
  fVar324 = fVar166 - pfVar2[1] * 0.33333334;
  fVar231 = fVar189 - pfVar2[2] * 0.33333334;
  fVar236 = fVar190 - pfVar2[3] * 0.33333334;
  fVar203 = fVar214 * 0.0;
  fVar212 = fVar273 * 0.0;
  fVar213 = fVar292 * 0.0;
  fVar257 = fVar298 * 0.0;
  fVar254 = fVar123 * 0.0 + fVar203;
  fVar317 = fVar124 * 0.0 + fVar212;
  fVar225 = fVar141 * 0.0 + fVar213;
  fVar262 = fVar143 * 0.0 + fVar257;
  fVar263 = fVar142 * 0.0;
  fVar274 = fVar191 * 0.0;
  fVar277 = fVar201 * 0.0;
  fVar279 = fVar202 * 0.0;
  fVar230 = fVar263 + fVar254 + fVar72;
  fVar281 = fVar274 + fVar317 + fVar102;
  fVar295 = fVar277 + fVar225 + fVar103;
  fVar301 = fVar279 + fVar262 + fVar122;
  fVar254 = (fVar142 * 3.0 + fVar254) - fVar72 * 3.0;
  fVar317 = (fVar191 * 3.0 + fVar317) - fVar102 * 3.0;
  fVar225 = (fVar201 * 3.0 + fVar225) - fVar103 * 3.0;
  fVar262 = (fVar202 * 3.0 + fVar262) - fVar122 * 3.0;
  fVar264 = fVar322 * 0.0;
  fVar275 = fVar324 * 0.0;
  fVar278 = fVar231 * 0.0;
  fVar280 = fVar236 * 0.0;
  fVar142 = fVar165 * 0.0 + fVar264;
  fVar191 = fVar166 * 0.0 + fVar275;
  fVar201 = fVar189 * 0.0 + fVar278;
  fVar202 = fVar190 * 0.0 + fVar280;
  fVar282 = fVar241 * 0.0;
  fVar293 = fVar276 * 0.0;
  fVar296 = fVar315 * 0.0;
  fVar299 = fVar318 * 0.0;
  fVar323 = fVar282 + fVar142 + fVar159;
  fVar226 = fVar293 + fVar191 + fVar160;
  fVar232 = fVar296 + fVar201 + fVar161;
  fVar237 = fVar299 + fVar202 + fVar164;
  fVar311 = (fVar241 * 3.0 + fVar142) - fVar159 * 3.0;
  fVar313 = (fVar276 * 3.0 + fVar191) - fVar160 * 3.0;
  fVar315 = (fVar315 * 3.0 + fVar201) - fVar161 * 3.0;
  fVar318 = (fVar318 * 3.0 + fVar202) - fVar164 * 3.0;
  fVar202 = fVar203 + fVar123 + fVar263 + fVar72 * 0.0;
  fVar212 = fVar212 + fVar124 + fVar274 + fVar102 * 0.0;
  fVar241 = fVar213 + fVar141 + fVar277 + fVar103 * 0.0;
  fVar276 = fVar257 + fVar143 + fVar279 + fVar122 * 0.0;
  fVar191 = ((fVar123 * 3.0 - fVar214 * 3.0) + fVar263) - fVar72 * 0.0;
  fVar201 = ((fVar124 * 3.0 - fVar273 * 3.0) + fVar274) - fVar102 * 0.0;
  fVar203 = ((fVar141 * 3.0 - fVar292 * 3.0) + fVar277) - fVar103 * 0.0;
  fVar213 = ((fVar143 * 3.0 - fVar298 * 3.0) + fVar279) - fVar122 * 0.0;
  fVar103 = fVar264 + fVar165 + fVar282 + fVar159 * 0.0;
  fVar122 = fVar275 + fVar166 + fVar293 + fVar160 * 0.0;
  fVar123 = fVar278 + fVar189 + fVar296 + fVar161 * 0.0;
  fVar124 = fVar280 + fVar190 + fVar299 + fVar164 * 0.0;
  fVar142 = ((fVar165 * 3.0 - fVar322 * 3.0) + fVar282) - fVar159 * 0.0;
  fVar72 = ((fVar166 * 3.0 - fVar324 * 3.0) + fVar293) - fVar160 * 0.0;
  fVar102 = ((fVar189 * 3.0 - fVar231 * 3.0) + fVar296) - fVar161 * 0.0;
  fVar165 = ((fVar190 * 3.0 - fVar236 * 3.0) + fVar299) - fVar164 * 0.0;
  fVar231 = fVar317 * fVar323 - fVar226 * fVar254;
  fVar236 = fVar225 * fVar226 - fVar232 * fVar317;
  fVar232 = fVar254 * fVar232 - fVar323 * fVar225;
  fVar237 = fVar262 * fVar237 - fVar237 * fVar262;
  fVar214 = fVar317 * fVar311 - fVar313 * fVar254;
  fVar323 = fVar225 * fVar313 - fVar315 * fVar317;
  fVar315 = fVar254 * fVar315 - fVar311 * fVar225;
  fVar298 = fVar201 * fVar103 - fVar122 * fVar191;
  fVar311 = fVar203 * fVar122 - fVar123 * fVar201;
  fVar313 = fVar191 * fVar123 - fVar103 * fVar203;
  fVar322 = fVar213 * fVar124 - fVar124 * fVar213;
  fVar189 = fVar201 * fVar142 - fVar72 * fVar191;
  fVar190 = fVar203 * fVar72 - fVar102 * fVar201;
  fVar292 = fVar191 * fVar102 - fVar142 * fVar203;
  fVar164 = fVar232 * fVar232 + fVar236 * fVar236 + fVar231 * fVar231;
  auVar73 = ZEXT416((uint)fVar164);
  auVar126 = rsqrtss(ZEXT416((uint)fVar164),auVar73);
  fVar142 = auVar126._0_4_;
  fVar324 = fVar142 * 1.5 - fVar142 * fVar142 * fVar164 * 0.5 * fVar142;
  fVar263 = fVar231 * fVar214 + fVar232 * fVar315 + fVar236 * fVar323;
  fVar257 = fVar237 * fVar324;
  auVar73 = rcpss(auVar73,auVar73);
  fVar273 = (2.0 - fVar164 * auVar73._0_4_) * auVar73._0_4_;
  fVar226 = fVar313 * fVar313 + fVar311 * fVar311 + fVar298 * fVar298;
  auVar126 = ZEXT416((uint)fVar226);
  auVar73 = rsqrtss(ZEXT416((uint)fVar226),auVar126);
  fVar142 = auVar73._0_4_;
  fVar264 = fVar142 * 1.5 - fVar142 * fVar142 * fVar226 * 0.5 * fVar142;
  fVar274 = fVar298 * fVar189 + fVar313 * fVar292 + fVar311 * fVar190;
  lVar14 = *(long *)(_Var13 + 0x38 + lVar63);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar63);
  pfVar1 = (float *)(lVar14 + lVar16 * uVar56);
  fVar142 = *pfVar1;
  fVar72 = pfVar1[1];
  fVar102 = pfVar1[2];
  fVar103 = pfVar1[3];
  pfVar1 = (float *)(lVar14 + lVar16 * uVar62);
  fVar122 = *pfVar1;
  fVar123 = pfVar1[1];
  fVar124 = pfVar1[2];
  fVar141 = pfVar1[3];
  lVar14 = *(long *)(lVar18 + 0x38 + lVar63);
  lVar18 = *(long *)(lVar18 + 0x48 + lVar63);
  pfVar1 = (float *)(lVar14 + lVar18 * uVar62);
  fVar143 = *pfVar1;
  fVar159 = pfVar1[1];
  fVar160 = pfVar1[2];
  fVar161 = pfVar1[3];
  lVar16 = *(long *)(_Var15 + 0x38 + lVar63);
  lVar17 = *(long *)(_Var15 + 0x48 + lVar63);
  auVar73 = rcpss(auVar126,auVar126);
  pfVar1 = (float *)(lVar16 + lVar17 * uVar62);
  fVar166 = fVar322 * fVar264;
  fVar275 = (2.0 - fVar226 * auVar73._0_4_) * auVar73._0_4_;
  fVar333 = fVar301 * fVar236 * fVar324;
  fVar340 = fVar301 * fVar232 * fVar324;
  fVar341 = fVar301 * fVar231 * fVar324;
  fVar342 = fVar301 * fVar257;
  fVar296 = fVar230 - fVar333;
  fVar227 = fVar281 - fVar340;
  fVar233 = fVar295 - fVar341;
  fVar238 = fVar301 - fVar342;
  fVar302 = fVar301 * fVar273 * (fVar164 * fVar323 - fVar263 * fVar236) * fVar324 +
            fVar262 * fVar236 * fVar324;
  fVar312 = fVar301 * fVar273 * (fVar164 * fVar315 - fVar263 * fVar232) * fVar324 +
            fVar262 * fVar232 * fVar324;
  fVar314 = fVar301 * fVar273 * (fVar164 * fVar214 - fVar263 * fVar231) * fVar324 +
            fVar262 * fVar231 * fVar324;
  fVar316 = fVar301 * fVar273 * (fVar164 * (fVar262 * fVar318 - fVar318 * fVar262) -
                                fVar263 * fVar237) * fVar324 + fVar262 * fVar257;
  fVar333 = fVar333 + fVar230;
  fVar340 = fVar340 + fVar281;
  fVar341 = fVar341 + fVar295;
  fVar342 = fVar342 + fVar301;
  fVar257 = fVar276 * fVar311 * fVar264;
  fVar214 = fVar276 * fVar313 * fVar264;
  fVar230 = fVar276 * fVar298 * fVar264;
  fVar273 = fVar276 * fVar166;
  pfVar2 = (float *)(*(long *)(p_Var59 + lVar63 + 0x38) +
                    *(long *)(p_Var59 + lVar63 + 0x48) * uVar62);
  fVar242 = fVar202 - fVar257;
  fVar255 = fVar212 - fVar214;
  fVar258 = fVar241 - fVar230;
  fVar260 = fVar276 - fVar273;
  fVar315 = fVar276 * fVar275 * (fVar226 * fVar190 - fVar274 * fVar311) * fVar264 +
            fVar213 * fVar311 * fVar264;
  fVar323 = fVar276 * fVar275 * (fVar226 * fVar292 - fVar274 * fVar313) * fVar264 +
            fVar213 * fVar313 * fVar264;
  fVar231 = fVar276 * fVar275 * (fVar226 * fVar189 - fVar274 * fVar298) * fVar264 +
            fVar213 * fVar298 * fVar264;
  fVar237 = fVar276 * fVar275 * (fVar226 * (fVar213 * fVar165 - fVar165 * fVar213) -
                                fVar274 * fVar322) * fVar264 + fVar213 * fVar166;
  fVar257 = fVar257 + fVar202;
  fVar214 = fVar214 + fVar212;
  fVar230 = fVar230 + fVar241;
  fVar273 = fVar273 + fVar276;
  fVar276 = fVar122 - *pfVar2 * 0.33333334;
  fVar292 = fVar123 - pfVar2[1] * 0.33333334;
  fVar298 = fVar124 - pfVar2[2] * 0.33333334;
  fVar311 = fVar141 - pfVar2[3] * 0.33333334;
  fVar274 = fVar143 - *pfVar1 * 0.33333334;
  fVar277 = fVar159 - pfVar1[1] * 0.33333334;
  fVar279 = fVar160 - pfVar1[2] * 0.33333334;
  fVar282 = fVar161 - pfVar1[3] * 0.33333334;
  fVar190 = fVar276 * 0.0;
  fVar202 = fVar292 * 0.0;
  fVar212 = fVar298 * 0.0;
  fVar241 = fVar311 * 0.0;
  fVar299 = fVar122 * 0.0 + fVar190;
  fVar228 = fVar123 * 0.0 + fVar202;
  fVar234 = fVar124 * 0.0 + fVar212;
  fVar239 = fVar141 * 0.0 + fVar241;
  pfVar1 = (float *)(*(long *)(p_Var59 + lVar63 + 0x38) +
                    *(long *)(p_Var59 + lVar63 + 0x48) * uVar56);
  fVar164 = *pfVar1 * 0.33333334 + fVar142;
  fVar165 = pfVar1[1] * 0.33333334 + fVar72;
  fVar166 = pfVar1[2] * 0.33333334 + fVar102;
  fVar189 = pfVar1[3] * 0.33333334 + fVar103;
  fVar318 = fVar164 * 0.0;
  fVar324 = fVar165 * 0.0;
  fVar232 = fVar166 * 0.0;
  fVar263 = fVar189 * 0.0;
  fVar281 = (fVar164 * 3.0 + fVar299) - fVar142 * 3.0;
  fVar295 = (fVar165 * 3.0 + fVar228) - fVar72 * 3.0;
  fVar301 = (fVar166 * 3.0 + fVar234) - fVar102 * 3.0;
  fVar313 = (fVar189 * 3.0 + fVar239) - fVar103 * 3.0;
  fVar243 = fVar274 * 0.0;
  fVar256 = fVar277 * 0.0;
  fVar259 = fVar279 * 0.0;
  fVar261 = fVar282 * 0.0;
  fVar215 = fVar143 * 0.0 + fVar243;
  fVar229 = fVar159 * 0.0 + fVar256;
  fVar235 = fVar160 * 0.0 + fVar259;
  fVar240 = fVar161 * 0.0 + fVar261;
  pfVar1 = (float *)(lVar16 + uVar56 * lVar17);
  pfVar2 = (float *)(lVar14 + lVar18 * uVar56);
  fVar164 = *pfVar2;
  fVar165 = pfVar2[1];
  fVar166 = pfVar2[2];
  fVar189 = pfVar2[3];
  fVar322 = *pfVar1 * 0.33333334 + fVar164;
  fVar226 = pfVar1[1] * 0.33333334 + fVar165;
  fVar236 = pfVar1[2] * 0.33333334 + fVar166;
  fVar264 = pfVar1[3] * 0.33333334 + fVar189;
  fVar283 = fVar322 * 0.0;
  fVar294 = fVar226 * 0.0;
  fVar297 = fVar236 * 0.0;
  fVar300 = fVar264 * 0.0;
  fVar275 = (fVar322 * 3.0 + fVar215) - fVar164 * 3.0;
  fVar278 = (fVar226 * 3.0 + fVar229) - fVar165 * 3.0;
  fVar280 = (fVar236 * 3.0 + fVar235) - fVar166 * 3.0;
  fVar293 = (fVar264 * 3.0 + fVar240) - fVar189 * 3.0;
  fVar322 = fVar318 + fVar299 + fVar142;
  fVar226 = fVar324 + fVar228 + fVar72;
  fVar236 = fVar232 + fVar234 + fVar102;
  fVar264 = fVar263 + fVar239 + fVar103;
  fVar190 = fVar190 + fVar122 + fVar318 + fVar142 * 0.0;
  fVar202 = fVar202 + fVar123 + fVar324 + fVar72 * 0.0;
  fVar212 = fVar212 + fVar124 + fVar232 + fVar102 * 0.0;
  fVar241 = fVar241 + fVar141 + fVar263 + fVar103 * 0.0;
  fVar142 = ((fVar122 * 3.0 - fVar276 * 3.0) + fVar318) - fVar142 * 0.0;
  fVar72 = ((fVar123 * 3.0 - fVar292 * 3.0) + fVar324) - fVar72 * 0.0;
  fVar102 = ((fVar124 * 3.0 - fVar298 * 3.0) + fVar232) - fVar102 * 0.0;
  fVar103 = ((fVar141 * 3.0 - fVar311 * 3.0) + fVar263) - fVar103 * 0.0;
  fVar141 = fVar283 + fVar215 + fVar164;
  fVar318 = fVar294 + fVar229 + fVar165;
  fVar232 = fVar297 + fVar235 + fVar166;
  fVar299 = fVar300 + fVar240 + fVar189;
  fVar276 = fVar243 + fVar143 + fVar283 + fVar164 * 0.0;
  fVar292 = fVar256 + fVar159 + fVar294 + fVar165 * 0.0;
  fVar311 = fVar259 + fVar160 + fVar297 + fVar166 * 0.0;
  fVar324 = fVar261 + fVar161 + fVar300 + fVar189 * 0.0;
  fVar122 = ((fVar143 * 3.0 - fVar274 * 3.0) + fVar283) - fVar164 * 0.0;
  fVar123 = ((fVar159 * 3.0 - fVar277 * 3.0) + fVar294) - fVar165 * 0.0;
  fVar124 = ((fVar160 * 3.0 - fVar279 * 3.0) + fVar297) - fVar166 * 0.0;
  fVar298 = ((fVar161 * 3.0 - fVar282 * 3.0) + fVar300) - fVar189 * 0.0;
  fVar165 = fVar295 * fVar141 - fVar318 * fVar281;
  fVar166 = fVar301 * fVar318 - fVar232 * fVar295;
  fVar263 = fVar281 * fVar232 - fVar141 * fVar301;
  fVar282 = fVar313 * fVar299 - fVar299 * fVar313;
  fVar141 = fVar295 * fVar275 - fVar278 * fVar281;
  fVar159 = fVar301 * fVar278 - fVar280 * fVar295;
  fVar161 = fVar281 * fVar280 - fVar275 * fVar301;
  fVar318 = fVar72 * fVar276 - fVar292 * fVar142;
  fVar232 = fVar102 * fVar292 - fVar311 * fVar72;
  fVar274 = fVar142 * fVar311 - fVar276 * fVar102;
  fVar277 = fVar103 * fVar324 - fVar324 * fVar103;
  fVar143 = fVar72 * fVar122 - fVar123 * fVar142;
  fVar160 = fVar102 * fVar123 - fVar124 * fVar72;
  fVar164 = fVar142 * fVar124 - fVar122 * fVar102;
  fVar122 = fVar263 * fVar263 + fVar166 * fVar166 + fVar165 * fVar165;
  auVar73 = ZEXT416((uint)fVar122);
  auVar126 = rsqrtss(ZEXT416((uint)fVar122),auVar73);
  fVar123 = auVar126._0_4_;
  fVar324 = fVar123 * 1.5 - fVar123 * fVar123 * fVar122 * 0.5 * fVar123;
  fVar275 = fVar165 * fVar141 + fVar263 * fVar161 + fVar166 * fVar159;
  auVar73 = rcpss(auVar73,auVar73);
  fVar123 = (2.0 - fVar122 * auVar73._0_4_) * auVar73._0_4_;
  fVar124 = fVar282 * fVar324;
  fVar279 = fVar274 * fVar274 + fVar232 * fVar232 + fVar318 * fVar318;
  auVar73 = ZEXT416((uint)fVar279);
  auVar126 = rsqrtss(ZEXT416((uint)fVar279),auVar73);
  fVar189 = auVar126._0_4_;
  fVar299 = fVar189 * 1.5 - fVar189 * fVar189 * fVar279 * 0.5 * fVar189;
  fVar215 = fVar318 * fVar143 + fVar274 * fVar164 + fVar232 * fVar160;
  auVar73 = rcpss(auVar73,auVar73);
  fVar228 = (2.0 - fVar279 * auVar73._0_4_) * auVar73._0_4_;
  fVar280 = fVar277 * fVar299;
  fVar189 = fVar264 * fVar166 * fVar324;
  fVar276 = fVar264 * fVar263 * fVar324;
  fVar292 = fVar264 * fVar165 * fVar324;
  fVar311 = fVar264 * fVar124;
  fVar159 = fVar264 * fVar123 * (fVar122 * fVar159 - fVar275 * fVar166) * fVar324 +
            fVar313 * fVar166 * fVar324;
  fVar161 = fVar264 * fVar123 * (fVar122 * fVar161 - fVar275 * fVar263) * fVar324 +
            fVar313 * fVar263 * fVar324;
  fVar165 = fVar264 * fVar123 * (fVar122 * fVar141 - fVar275 * fVar165) * fVar324 +
            fVar313 * fVar165 * fVar324;
  fVar166 = fVar264 * fVar123 * (fVar122 * (fVar313 * fVar293 - fVar293 * fVar313) -
                                fVar275 * fVar282) * fVar324 + fVar313 * fVar124;
  fVar324 = fVar322 - fVar189;
  fVar263 = fVar226 - fVar276;
  fVar275 = fVar236 - fVar292;
  fVar278 = fVar264 - fVar311;
  fVar189 = fVar189 + fVar322;
  fVar276 = fVar276 + fVar226;
  fVar292 = fVar292 + fVar236;
  fVar311 = fVar311 + fVar264;
  fVar122 = fVar241 * fVar232 * fVar299;
  fVar123 = fVar241 * fVar274 * fVar299;
  fVar124 = fVar241 * fVar318 * fVar299;
  fVar141 = fVar241 * fVar280;
  fVar322 = fVar241 * fVar228 * (fVar279 * fVar160 - fVar215 * fVar232) * fVar299 +
            fVar103 * fVar232 * fVar299;
  fVar226 = fVar241 * fVar228 * (fVar279 * fVar164 - fVar215 * fVar274) * fVar299 +
            fVar103 * fVar274 * fVar299;
  fVar318 = fVar241 * fVar228 * (fVar279 * fVar143 - fVar215 * fVar318) * fVar299 +
            fVar103 * fVar318 * fVar299;
  fVar232 = fVar241 * fVar228 * (fVar279 * (fVar103 * fVar298 - fVar298 * fVar103) -
                                fVar215 * fVar277) * fVar299 + fVar103 * fVar280;
  fVar143 = fVar190 - fVar122;
  fVar160 = fVar202 - fVar123;
  fVar164 = fVar212 - fVar124;
  fVar298 = fVar241 - fVar141;
  fVar122 = fVar122 + fVar190;
  fVar123 = fVar123 + fVar202;
  fVar124 = fVar124 + fVar212;
  fVar141 = fVar141 + fVar241;
  fVar190 = 1.0 - fVar101;
  local_398 = fVar296 * fVar190 + fVar324 * fVar101;
  fStack_394 = fVar227 * fVar190 + fVar263 * fVar101;
  fStack_390 = fVar233 * fVar190 + fVar275 * fVar101;
  fStack_38c = fVar238 * fVar190 + fVar278 * fVar101;
  local_3a8 = ((fVar254 - fVar302) * 0.33333334 + fVar296) * fVar190 +
              ((fVar281 - fVar159) * 0.33333334 + fVar324) * fVar101;
  fStack_3a4 = ((fVar317 - fVar312) * 0.33333334 + fVar227) * fVar190 +
               ((fVar295 - fVar161) * 0.33333334 + fVar263) * fVar101;
  fStack_3a0 = ((fVar225 - fVar314) * 0.33333334 + fVar233) * fVar190 +
               ((fVar301 - fVar165) * 0.33333334 + fVar275) * fVar101;
  fStack_39c = ((fVar262 - fVar316) * 0.33333334 + fVar238) * fVar190 +
               ((fVar313 - fVar166) * 0.33333334 + fVar278) * fVar101;
  local_3c8 = (fVar242 - (fVar191 - fVar315) * 0.33333334) * fVar190 +
              (fVar143 - (fVar142 - fVar322) * 0.33333334) * fVar101;
  fStack_3c4 = (fVar255 - (fVar201 - fVar323) * 0.33333334) * fVar190 +
               (fVar160 - (fVar72 - fVar226) * 0.33333334) * fVar101;
  fStack_3c0 = (fVar258 - (fVar203 - fVar231) * 0.33333334) * fVar190 +
               (fVar164 - (fVar102 - fVar318) * 0.33333334) * fVar101;
  fStack_3bc = (fVar260 - (fVar213 - fVar237) * 0.33333334) * fVar190 +
               (fVar298 - (fVar103 - fVar232) * 0.33333334) * fVar101;
  local_3b8 = fVar242 * fVar190 + fVar143 * fVar101;
  fStack_3b4 = fVar255 * fVar190 + fVar160 * fVar101;
  fStack_3b0 = fVar258 * fVar190 + fVar164 * fVar101;
  fStack_3ac = fVar260 * fVar190 + fVar298 * fVar101;
  local_348 = fVar333 * fVar190 + fVar189 * fVar101;
  fStack_344 = fVar340 * fVar190 + fVar276 * fVar101;
  fStack_340 = fVar341 * fVar190 + fVar292 * fVar101;
  fStack_33c = fVar342 * fVar190 + fVar311 * fVar101;
  local_3d8 = ((fVar302 + fVar254) * 0.33333334 + fVar333) * fVar190 +
              ((fVar159 + fVar281) * 0.33333334 + fVar189) * fVar101;
  fStack_3d4 = ((fVar312 + fVar317) * 0.33333334 + fVar340) * fVar190 +
               ((fVar161 + fVar295) * 0.33333334 + fVar276) * fVar101;
  fStack_3d0 = ((fVar314 + fVar225) * 0.33333334 + fVar341) * fVar190 +
               ((fVar165 + fVar301) * 0.33333334 + fVar292) * fVar101;
  fStack_3cc = ((fVar316 + fVar262) * 0.33333334 + fVar342) * fVar190 +
               ((fVar166 + fVar313) * 0.33333334 + fVar311) * fVar101;
  local_3e8 = (fVar257 - (fVar315 + fVar191) * 0.33333334) * fVar190 +
              (fVar122 - (fVar322 + fVar142) * 0.33333334) * fVar101;
  fStack_3e4 = (fVar214 - (fVar323 + fVar201) * 0.33333334) * fVar190 +
               (fVar123 - (fVar226 + fVar72) * 0.33333334) * fVar101;
  fStack_3e0 = (fVar230 - (fVar231 + fVar203) * 0.33333334) * fVar190 +
               (fVar124 - (fVar318 + fVar102) * 0.33333334) * fVar101;
  fStack_3dc = (fVar273 - (fVar237 + fVar213) * 0.33333334) * fVar190 +
               (fVar141 - (fVar232 + fVar103) * 0.33333334) * fVar101;
  local_2b8 = fVar190 * fVar257 + fVar101 * fVar122;
  fStack_2b4 = fVar190 * fVar214 + fVar101 * fVar123;
  fStack_2b0 = fVar190 * fVar230 + fVar101 * fVar124;
  fStack_2ac = fVar190 * fVar273 + fVar101 * fVar141;
  fVar142 = (ray->org).field_0.m128[0];
  fVar72 = (ray->org).field_0.m128[1];
  fVar101 = (ray->org).field_0.m128[2];
  fVar102 = (pre->ray_space).vx.field_0.m128[0];
  fVar103 = (pre->ray_space).vx.field_0.m128[1];
  fVar122 = (pre->ray_space).vy.field_0.m128[0];
  fVar123 = (pre->ray_space).vy.field_0.m128[1];
  fVar124 = (pre->ray_space).vz.field_0.m128[0];
  fVar141 = (pre->ray_space).vz.field_0.m128[1];
  local_318 = (local_398 - fVar142) * fVar102 +
              (fStack_394 - fVar72) * fVar122 + (fStack_390 - fVar101) * fVar124;
  fStack_314 = (local_398 - fVar142) * fVar103 +
               (fStack_394 - fVar72) * fVar123 + (fStack_390 - fVar101) * fVar141;
  local_208 = CONCAT44(fStack_314,local_318);
  fVar160 = (local_3a8 - fVar142) * fVar102 +
            (fStack_3a4 - fVar72) * fVar122 + (fStack_3a0 - fVar101) * fVar124;
  fVar161 = (local_3a8 - fVar142) * fVar103 +
            (fStack_3a4 - fVar72) * fVar123 + (fStack_3a0 - fVar101) * fVar141;
  local_218 = CONCAT44(fVar161,fVar160);
  fVar143 = (local_3c8 - fVar142) * fVar102 +
            (fStack_3c4 - fVar72) * fVar122 + (fStack_3c0 - fVar101) * fVar124;
  fVar159 = (local_3c8 - fVar142) * fVar103 +
            (fStack_3c4 - fVar72) * fVar123 + (fStack_3c0 - fVar101) * fVar141;
  local_338 = CONCAT44(fVar159,fVar143);
  fVar164 = (local_3b8 - fVar142) * fVar102 +
            (fStack_3b4 - fVar72) * fVar122 + (fStack_3b0 - fVar101) * fVar124;
  fVar165 = (local_3b8 - fVar142) * fVar103 +
            (fStack_3b4 - fVar72) * fVar123 + (fStack_3b0 - fVar101) * fVar141;
  local_238 = CONCAT44(fVar165,fVar164);
  fStack_310 = (local_348 - fVar142) * fVar102 +
               (fStack_344 - fVar72) * fVar122 + (fStack_340 - fVar101) * fVar124;
  fStack_30c = (local_348 - fVar142) * fVar103 +
               (fStack_344 - fVar72) * fVar123 + (fStack_340 - fVar101) * fVar141;
  local_248 = CONCAT44(fStack_30c,fStack_310);
  fVar166 = (local_3d8 - fVar142) * fVar102 +
            (fStack_3d4 - fVar72) * fVar122 + (fStack_3d0 - fVar101) * fVar124;
  fVar189 = (local_3d8 - fVar142) * fVar103 +
            (fStack_3d4 - fVar72) * fVar123 + (fStack_3d0 - fVar101) * fVar141;
  local_258 = CONCAT44(fVar189,fVar166);
  fVar190 = (local_3e8 - fVar142) * fVar102 +
            (fStack_3e4 - fVar72) * fVar122 + (fStack_3e0 - fVar101) * fVar124;
  fVar191 = (local_3e8 - fVar142) * fVar103 +
            (fStack_3e4 - fVar72) * fVar123 + (fStack_3e0 - fVar101) * fVar141;
  uStack_330 = CONCAT44(fVar191,fVar190);
  fVar102 = (local_2b8 - fVar142) * fVar102 +
            (fStack_2b4 - fVar72) * fVar122 + (fStack_2b0 - fVar101) * fVar124;
  fVar72 = (local_2b8 - fVar142) * fVar103 +
           (fStack_2b4 - fVar72) * fVar123 + (fStack_2b0 - fVar101) * fVar141;
  local_278 = CONCAT44(fVar72,fVar102);
  register0x00001308 = local_258;
  local_328 = local_218;
  register0x000012c8 = local_278;
  local_b8 = local_238;
  auVar93._8_4_ = fStack_310;
  auVar93._0_8_ = local_208;
  auVar93._12_4_ = fStack_30c;
  auVar73 = minps(auVar93,_local_328);
  auVar115._8_4_ = fVar190;
  auVar115._0_8_ = local_338;
  auVar115._12_4_ = fVar191;
  auVar126 = minps(auVar115,_local_b8);
  auVar73 = minps(auVar73,auVar126);
  auVar116._4_4_ = fStack_314;
  auVar116._0_4_ = local_318;
  auVar116._8_4_ = fStack_310;
  auVar116._12_4_ = fStack_30c;
  auVar126 = maxps(auVar116,_local_328);
  auVar127._4_4_ = fVar159;
  auVar127._0_4_ = fVar143;
  auVar127._8_4_ = fVar190;
  auVar127._12_4_ = fVar191;
  auVar128 = maxps(auVar127,_local_b8);
  auVar117 = maxps(auVar126,auVar128);
  auVar21._4_8_ = auVar128._8_8_;
  auVar21._0_4_ = auVar73._4_4_;
  auVar129._0_8_ = auVar21._0_8_ << 0x20;
  auVar129._8_4_ = auVar73._8_4_;
  auVar129._12_4_ = auVar73._12_4_;
  auVar130._8_8_ = auVar73._8_8_;
  auVar130._0_8_ = auVar129._8_8_;
  auVar126 = minps(auVar73,auVar130);
  auVar22._4_8_ = auVar73._8_8_;
  auVar22._0_4_ = auVar117._4_4_;
  auVar131._0_8_ = auVar22._0_8_ << 0x20;
  auVar131._8_4_ = auVar117._8_4_;
  auVar131._12_4_ = auVar117._12_4_;
  auVar132._8_8_ = auVar117._8_8_;
  auVar132._0_8_ = auVar131._8_8_;
  auVar73 = maxps(auVar117,auVar132);
  auVar94._0_8_ = auVar126._0_8_ & 0x7fffffff7fffffff;
  auVar94._8_4_ = auVar126._8_4_ & 0x7fffffff;
  auVar94._12_4_ = auVar126._12_4_ & 0x7fffffff;
  auVar118._0_8_ = auVar73._0_8_ & 0x7fffffff7fffffff;
  auVar118._8_4_ = auVar73._8_4_ & 0x7fffffff;
  auVar118._12_4_ = auVar73._12_4_ & 0x7fffffff;
  auVar73 = maxps(auVar94,auVar118);
  fVar142 = auVar73._4_4_;
  if (auVar73._4_4_ <= auVar73._0_4_) {
    fVar142 = auVar73._0_4_;
  }
  local_2f0 = (ulong)uVar66 + 0xf;
  fVar142 = fVar142 * 9.536743e-07;
  local_148 = fVar142;
  fStack_144 = fVar142;
  fStack_140 = fVar142;
  fStack_13c = fVar142;
  local_158 = -fVar142;
  fStack_154 = -fVar142;
  fStack_150 = -fVar142;
  fStack_14c = -fVar142;
  local_88 = fVar160 - local_318;
  fStack_84 = fVar161 - fStack_314;
  fStack_80 = fVar166 - fStack_310;
  fStack_7c = fVar189 - fStack_30c;
  local_98 = fVar143 - fVar160;
  fStack_94 = fVar159 - fVar161;
  fStack_90 = fVar190 - fVar166;
  fStack_8c = fVar191 - fVar189;
  local_a8 = fVar164 - fVar143;
  fStack_a4 = fVar165 - fVar159;
  fStack_a0 = fVar102 - fVar190;
  fStack_9c = fVar72 - fVar191;
  local_188 = local_348 - local_398;
  fStack_184 = fStack_344 - fStack_394;
  fStack_180 = fStack_340 - fStack_390;
  fStack_17c = fStack_33c - fStack_38c;
  local_198 = local_3d8 - local_3a8;
  fStack_194 = fStack_3d4 - fStack_3a4;
  fStack_190 = fStack_3d0 - fStack_3a0;
  fStack_18c = fStack_3cc - fStack_39c;
  local_1a8 = local_3e8 - local_3c8;
  fStack_1a4 = fStack_3e4 - fStack_3c4;
  fStack_1a0 = fStack_3e0 - fStack_3c0;
  fStack_19c = fStack_3dc - fStack_3bc;
  local_1b8 = local_2b8 - local_3b8;
  fStack_1b4 = fStack_2b4 - fStack_3b4;
  fStack_1b0 = fStack_2b0 - fStack_3b0;
  fStack_1ac = fStack_2ac - fStack_3ac;
  local_43c = 0;
  uVar56 = 0;
  local_428 = 0x3f80000000000000;
  local_388 = 0x3f80000000000000;
  uStack_380 = 0;
  local_300 = (ulong)uVar67;
  uStack_270 = local_278;
  local_268 = uStack_330;
  uStack_260 = uStack_330;
  uStack_250 = local_258;
  uStack_240 = local_248;
  uStack_230 = local_238;
  local_228 = local_338;
  uStack_220 = local_338;
  uStack_210 = local_218;
  uStack_200 = local_208;
  do {
    fVar72 = 1.0 - (float)local_428;
    fVar101 = 1.0 - (float)local_428;
    fVar102 = 1.0 - local_428._4_4_;
    fVar103 = 1.0 - local_428._4_4_;
    fVar122 = (float)local_208 * fVar72 + (float)local_248 * (float)local_428;
    fVar164 = local_208._4_4_ * fVar101 + local_248._4_4_ * (float)local_428;
    fVar165 = (float)uStack_200 * fVar102 + (float)uStack_240 * local_428._4_4_;
    fVar166 = uStack_200._4_4_ * fVar103 + uStack_240._4_4_ * local_428._4_4_;
    fVar159 = (float)local_218 * fVar72 + (float)local_258 * (float)local_428;
    fVar202 = local_218._4_4_ * fVar101 + local_258._4_4_ * (float)local_428;
    fVar203 = (float)uStack_210 * fVar102 + (float)uStack_250 * local_428._4_4_;
    fVar212 = uStack_210._4_4_ * fVar103 + uStack_250._4_4_ * local_428._4_4_;
    fVar213 = (float)local_228 * fVar72 + (float)local_268 * (float)local_428;
    fVar241 = local_228._4_4_ * fVar101 + local_268._4_4_ * (float)local_428;
    fVar254 = (float)uStack_220 * fVar102 + (float)uStack_260 * local_428._4_4_;
    fVar257 = uStack_220._4_4_ * fVar103 + uStack_260._4_4_ * local_428._4_4_;
    fVar292 = fVar72 * (float)local_238 + (float)local_428 * (float)local_278;
    fVar295 = fVar101 * local_238._4_4_ + (float)local_428 * local_278._4_4_;
    fVar298 = fVar102 * (float)uStack_230 + local_428._4_4_ * (float)uStack_270;
    fVar301 = fVar103 * uStack_230._4_4_ + local_428._4_4_ * uStack_270._4_4_;
    fVar72 = (local_388._4_4_ - (float)local_388) * 0.11111111;
    fVar317 = (local_388._4_4_ - (float)local_388) * 0.0 + (float)local_388;
    fVar214 = (local_388._4_4_ - (float)local_388) * 0.33333334 + (float)local_388;
    fVar225 = (local_388._4_4_ - (float)local_388) * 0.6666667 + (float)local_388;
    fVar230 = (local_388._4_4_ - (float)local_388) * 1.0 + (float)local_388;
    fVar262 = 1.0 - fVar317;
    fVar273 = 1.0 - fVar214;
    fVar276 = 1.0 - fVar225;
    fVar281 = 1.0 - fVar230;
    fVar123 = fVar159 * fVar262 + fVar213 * fVar317;
    fVar124 = fVar159 * fVar273 + fVar213 * fVar214;
    fVar141 = fVar159 * fVar276 + fVar213 * fVar225;
    fVar143 = fVar159 * fVar281 + fVar213 * fVar230;
    fVar189 = fVar202 * fVar262 + fVar241 * fVar317;
    fVar190 = fVar202 * fVar273 + fVar241 * fVar214;
    fVar191 = fVar202 * fVar276 + fVar241 * fVar225;
    fVar201 = fVar202 * fVar281 + fVar241 * fVar230;
    fVar101 = (fVar122 * fVar262 + fVar159 * fVar317) * fVar262 + fVar317 * fVar123;
    fVar102 = (fVar122 * fVar273 + fVar159 * fVar214) * fVar273 + fVar214 * fVar124;
    fVar103 = (fVar122 * fVar276 + fVar159 * fVar225) * fVar276 + fVar225 * fVar141;
    fVar122 = (fVar122 * fVar281 + fVar159 * fVar230) * fVar281 + fVar230 * fVar143;
    fVar159 = (fVar164 * fVar262 + fVar202 * fVar317) * fVar262 + fVar317 * fVar189;
    fVar160 = (fVar164 * fVar273 + fVar202 * fVar214) * fVar273 + fVar214 * fVar190;
    fVar161 = (fVar164 * fVar276 + fVar202 * fVar225) * fVar276 + fVar225 * fVar191;
    fVar164 = (fVar164 * fVar281 + fVar202 * fVar230) * fVar281 + fVar230 * fVar201;
    fVar123 = fVar123 * fVar262 + (fVar213 * fVar262 + fVar292 * fVar317) * fVar317;
    fVar124 = fVar124 * fVar273 + (fVar213 * fVar273 + fVar292 * fVar214) * fVar214;
    fVar141 = fVar141 * fVar276 + (fVar213 * fVar276 + fVar292 * fVar225) * fVar225;
    fVar143 = fVar143 * fVar281 + (fVar213 * fVar281 + fVar292 * fVar230) * fVar230;
    fVar189 = fVar189 * fVar262 + (fVar241 * fVar262 + fVar295 * fVar317) * fVar317;
    fVar190 = fVar190 * fVar273 + (fVar241 * fVar273 + fVar295 * fVar214) * fVar214;
    fVar191 = fVar191 * fVar276 + (fVar241 * fVar276 + fVar295 * fVar225) * fVar225;
    fVar201 = fVar201 * fVar281 + (fVar241 * fVar281 + fVar295 * fVar230) * fVar230;
    local_2a8 = fVar262 * fVar101 + fVar317 * fVar123;
    fStack_2a4 = fVar273 * fVar102 + fVar214 * fVar124;
    fStack_2a0 = fVar276 * fVar103 + fVar225 * fVar141;
    fStack_29c = fVar281 * fVar122 + fVar230 * fVar143;
    local_298 = fVar262 * fVar159 + fVar317 * fVar189;
    fStack_294 = fVar273 * fVar160 + fVar214 * fVar190;
    fStack_290 = fVar276 * fVar161 + fVar225 * fVar191;
    fStack_28c = fVar281 * fVar164 + fVar230 * fVar201;
    fVar124 = (fVar124 - fVar102) * 3.0 * fVar72;
    fVar103 = (fVar141 - fVar103) * 3.0 * fVar72;
    fVar122 = (fVar143 - fVar122) * 3.0 * fVar72;
    fVar141 = (fVar190 - fVar160) * 3.0 * fVar72;
    fVar143 = (fVar191 - fVar161) * 3.0 * fVar72;
    fVar160 = (fVar201 - fVar164) * 3.0 * fVar72;
    local_e8._4_4_ = fStack_2a0;
    local_e8._0_4_ = fStack_2a4;
    local_c8._4_4_ = fStack_290;
    local_c8._0_4_ = fStack_294;
    local_358._0_4_ = local_2a8 + (fVar123 - fVar101) * 3.0 * fVar72;
    local_358._4_4_ = fStack_2a4 + fVar124;
    fStack_350 = fStack_2a0 + fVar103;
    fStack_34c = fStack_29c + fVar122;
    fVar101 = local_298 + (fVar189 - fVar159) * 3.0 * fVar72;
    fVar102 = fStack_294 + fVar141;
    fStack_430 = fStack_290 + fVar143;
    fStack_42c = fStack_28c + fVar160;
    local_288._0_4_ = fStack_2a4 - fVar124;
    local_288._4_4_ = fStack_2a0 - fVar103;
    local_288._8_4_ = fStack_29c - fVar122;
    local_288._12_4_ = 0;
    local_c8._8_4_ = fStack_28c;
    local_c8._12_4_ = 0;
    local_d8._0_4_ = fStack_294 - fVar141;
    local_d8._4_4_ = fStack_290 - fVar143;
    local_d8._8_4_ = fStack_28c - fVar160;
    local_d8._12_4_ = 0;
    fVar103 = fVar203 * fVar262 + fVar254 * fVar317;
    fVar122 = fVar203 * fVar273 + fVar254 * fVar214;
    fVar123 = fVar203 * fVar276 + fVar254 * fVar225;
    fVar124 = fVar203 * fVar281 + fVar254 * fVar230;
    fVar141 = fVar212 * fVar262 + fVar257 * fVar317;
    fVar143 = fVar212 * fVar273 + fVar257 * fVar214;
    fVar159 = fVar212 * fVar276 + fVar257 * fVar225;
    fVar160 = fVar212 * fVar281 + fVar257 * fVar230;
    fVar189 = (fVar165 * fVar262 + fVar203 * fVar317) * fVar262 + fVar317 * fVar103;
    fVar190 = (fVar165 * fVar273 + fVar203 * fVar214) * fVar273 + fVar214 * fVar122;
    fVar191 = (fVar165 * fVar276 + fVar203 * fVar225) * fVar276 + fVar225 * fVar123;
    fVar201 = (fVar165 * fVar281 + fVar203 * fVar230) * fVar281 + fVar230 * fVar124;
    fVar161 = (fVar166 * fVar262 + fVar212 * fVar317) * fVar262 + fVar317 * fVar141;
    fVar164 = (fVar166 * fVar273 + fVar212 * fVar214) * fVar273 + fVar214 * fVar143;
    fVar165 = (fVar166 * fVar276 + fVar212 * fVar225) * fVar276 + fVar225 * fVar159;
    fVar166 = (fVar166 * fVar281 + fVar212 * fVar230) * fVar281 + fVar230 * fVar160;
    fVar103 = fVar103 * fVar262 + (fVar254 * fVar262 + fVar298 * fVar317) * fVar317;
    fVar122 = fVar122 * fVar273 + (fVar254 * fVar273 + fVar298 * fVar214) * fVar214;
    fVar123 = fVar123 * fVar276 + (fVar254 * fVar276 + fVar298 * fVar225) * fVar225;
    fVar124 = fVar124 * fVar281 + (fVar254 * fVar281 + fVar298 * fVar230) * fVar230;
    fVar202 = fVar141 * fVar262 + (fVar257 * fVar262 + fVar301 * fVar317) * fVar317;
    fVar203 = fVar143 * fVar273 + (fVar257 * fVar273 + fVar301 * fVar214) * fVar214;
    fVar212 = fVar159 * fVar276 + (fVar257 * fVar276 + fVar301 * fVar225) * fVar225;
    fVar213 = fVar160 * fVar281 + (fVar257 * fVar281 + fVar301 * fVar230) * fVar230;
    fVar141 = fVar262 * fVar189 + fVar317 * fVar103;
    fVar143 = fVar273 * fVar190 + fVar214 * fVar122;
    fVar159 = fVar276 * fVar191 + fVar225 * fVar123;
    fVar160 = fVar281 * fVar201 + fVar230 * fVar124;
    fVar241 = fVar262 * fVar161 + fVar317 * fVar202;
    fVar254 = fVar273 * fVar164 + fVar214 * fVar203;
    fVar257 = fVar276 * fVar165 + fVar225 * fVar212;
    fVar317 = fVar281 * fVar166 + fVar230 * fVar213;
    fVar122 = (fVar122 - fVar190) * 3.0 * fVar72;
    fVar123 = (fVar123 - fVar191) * 3.0 * fVar72;
    fVar124 = (fVar124 - fVar201) * 3.0 * fVar72;
    fVar164 = (fVar203 - fVar164) * 3.0 * fVar72;
    fVar165 = (fVar212 - fVar165) * 3.0 * fVar72;
    fVar166 = (fVar213 - fVar166) * 3.0 * fVar72;
    local_f8._4_4_ = fVar159;
    local_f8._0_4_ = fVar143;
    local_f8._8_4_ = fVar160;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar257;
    local_118._0_4_ = fVar254;
    local_118._8_4_ = fVar317;
    local_118._12_4_ = 0;
    local_368 = fVar141 + (fVar103 - fVar189) * 3.0 * fVar72;
    fStack_364 = fVar143 + fVar122;
    fStack_360 = fVar159 + fVar123;
    fStack_35c = fVar160 + fVar124;
    local_108 = fVar241 + (fVar202 - fVar161) * 3.0 * fVar72;
    fStack_104 = fVar254 + fVar164;
    fStack_100 = fVar257 + fVar165;
    fStack_fc = fVar317 + fVar166;
    local_138._0_4_ = fVar143 - fVar122;
    local_138._4_4_ = fVar159 - fVar123;
    local_138._8_4_ = fVar160 - fVar124;
    local_138._12_4_ = 0;
    local_128._0_4_ = fVar254 - fVar164;
    local_128._4_4_ = fVar257 - fVar165;
    local_128._8_4_ = fVar317 - fVar166;
    local_128._12_4_ = 0;
    local_e8._8_4_ = fStack_29c;
    local_e8._12_4_ = 0;
    fVar124 = (fVar143 - fStack_2a4) + (fVar141 - local_2a8);
    fVar161 = (fVar159 - fStack_2a0) + (fVar143 - fStack_2a4);
    fVar164 = (fVar160 - fStack_29c) + (fVar159 - fStack_2a0);
    fVar165 = (fVar160 - fStack_29c) + 0.0;
    fVar72 = (fVar254 - fStack_294) + (fVar241 - local_298);
    fVar103 = (fVar257 - fStack_290) + (fVar254 - fStack_294);
    fVar122 = (fVar317 - fStack_28c) + (fVar257 - fStack_290);
    fVar123 = (fVar317 - fStack_28c) + 0.0;
    auVar183._0_8_ =
         CONCAT44(fStack_294 * fVar161 - fStack_2a4 * fVar103,
                  local_298 * fVar124 - local_2a8 * fVar72);
    auVar183._8_4_ = fStack_290 * fVar164 - fStack_2a0 * fVar122;
    auVar183._12_4_ = fStack_28c * fVar165 - fStack_29c * fVar123;
    auVar133._0_4_ = fVar101 * fVar124 - (float)local_358._0_4_ * fVar72;
    auVar133._4_4_ = fVar102 * fVar161 - (float)local_358._4_4_ * fVar103;
    auVar133._8_4_ = fStack_430 * fVar164 - fStack_350 * fVar122;
    auVar133._12_4_ = fStack_42c * fVar165 - fStack_34c * fVar123;
    auVar149._0_8_ =
         CONCAT44(local_d8._4_4_ * fVar161 - fVar103 * local_288._4_4_,
                  local_d8._0_4_ * fVar124 - fVar72 * local_288._0_4_);
    auVar149._8_4_ = local_d8._8_4_ * fVar164 - fVar122 * local_288._8_4_;
    auVar149._12_4_ = fVar165 * 0.0 - fVar123 * 0.0;
    auVar334._0_4_ = fVar124 * fStack_294 - fVar72 * fStack_2a4;
    auVar334._4_4_ = fVar161 * fStack_290 - fVar103 * fStack_2a0;
    auVar334._8_4_ = fVar164 * fStack_28c - fVar122 * fStack_29c;
    auVar334._12_4_ = fVar165 * 0.0 - fVar123 * 0.0;
    auVar95._0_8_ =
         CONCAT44(fVar254 * fVar161 - fVar143 * fVar103,fVar241 * fVar124 - fVar141 * fVar72);
    auVar95._8_4_ = fVar257 * fVar164 - fVar159 * fVar122;
    auVar95._12_4_ = fVar317 * fVar165 - fVar160 * fVar123;
    auVar289._0_4_ = local_108 * fVar124 - local_368 * fVar72;
    auVar289._4_4_ = fStack_104 * fVar161 - fStack_364 * fVar103;
    auVar289._8_4_ = fStack_100 * fVar164 - fStack_360 * fVar122;
    auVar289._12_4_ = fStack_fc * fVar165 - fStack_35c * fVar123;
    auVar216._0_8_ =
         CONCAT44(local_128._4_4_ * fVar161 - fVar103 * local_138._4_4_,
                  local_128._0_4_ * fVar124 - fVar72 * local_138._0_4_);
    auVar216._8_4_ = local_128._8_4_ * fVar164 - fVar122 * local_138._8_4_;
    auVar216._12_4_ = fVar165 * 0.0 - fVar123 * 0.0;
    auVar269._0_4_ = fVar124 * fVar254 - fVar72 * fVar143;
    auVar269._4_4_ = fVar161 * fVar257 - fVar103 * fVar159;
    auVar269._8_4_ = fVar164 * fVar317 - fVar122 * fVar160;
    auVar269._12_4_ = fVar165 * 0.0 - fVar123 * 0.0;
    auVar325._8_4_ = auVar183._8_4_;
    auVar325._0_8_ = auVar183._0_8_;
    auVar325._12_4_ = auVar183._12_4_;
    auVar117 = minps(auVar325,auVar133);
    auVar126 = maxps(auVar183,auVar133);
    auVar134._8_4_ = auVar149._8_4_;
    auVar134._0_8_ = auVar149._0_8_;
    auVar134._12_4_ = auVar149._12_4_;
    auVar73 = minps(auVar134,auVar334);
    auVar326 = minps(auVar117,auVar73);
    auVar73 = maxps(auVar149,auVar334);
    auVar128 = maxps(auVar126,auVar73);
    auVar135._8_4_ = auVar95._8_4_;
    auVar135._0_8_ = auVar95._0_8_;
    auVar135._12_4_ = auVar95._12_4_;
    auVar126 = minps(auVar135,auVar289);
    auVar73 = maxps(auVar95,auVar289);
    auVar150._8_4_ = auVar216._8_4_;
    auVar150._0_8_ = auVar216._0_8_;
    auVar150._12_4_ = auVar216._12_4_;
    auVar117 = minps(auVar150,auVar269);
    auVar126 = minps(auVar126,auVar117);
    auVar117 = minps(auVar326,auVar126);
    auVar126 = maxps(auVar216,auVar269);
    auVar73 = maxps(auVar73,auVar126);
    auVar73 = maxps(auVar128,auVar73);
    bVar65 = auVar117._4_4_ <= fStack_144;
    bVar19 = auVar117._8_4_ <= fStack_140;
    bVar20 = auVar117._12_4_ <= fStack_13c;
    auVar53._4_4_ = -(uint)bVar19;
    auVar53._0_4_ = -(uint)bVar65;
    auVar53._8_4_ = -(uint)bVar20;
    auVar53._12_4_ = 0;
    auVar327 = auVar53 << 0x20;
    auVar184._0_4_ =
         -(uint)(local_158 <= auVar73._0_4_ && auVar117._0_4_ <= local_148) & local_168._0_4_;
    auVar184._4_4_ = -(uint)(fStack_154 <= auVar73._4_4_ && bVar65) & local_168._4_4_;
    auVar184._8_4_ = -(uint)(fStack_150 <= auVar73._8_4_ && bVar19) & local_168._8_4_;
    auVar184._12_4_ = -(uint)(fStack_14c <= auVar73._12_4_ && bVar20) & local_168._12_4_;
    iVar60 = movmskps((int)uVar62,auVar184);
    uVar57 = 0;
    if (iVar60 != 0) {
      fVar124 = (fVar143 - fVar141) + (fStack_2a4 - local_2a8);
      fVar161 = (fVar159 - fVar143) + (fStack_2a0 - fStack_2a4);
      fVar164 = (fVar160 - fVar159) + (fStack_29c - fStack_2a0);
      fVar165 = (0.0 - fVar160) + (0.0 - fStack_29c);
      fVar72 = (fVar254 - fVar241) + (fStack_294 - local_298);
      fVar103 = (fVar257 - fVar254) + (fStack_290 - fStack_294);
      fVar122 = (fVar317 - fVar257) + (fStack_28c - fStack_290);
      fVar123 = (0.0 - fVar317) + (0.0 - fStack_28c);
      auVar335._0_8_ =
           CONCAT44(fStack_294 * fVar161 - fStack_2a4 * fVar103,
                    local_298 * fVar124 - local_2a8 * fVar72);
      auVar335._8_4_ = fStack_290 * fVar164 - fStack_2a0 * fVar122;
      auVar335._12_4_ = fStack_28c * fVar165 - fStack_29c * fVar123;
      auVar136._0_4_ = fVar101 * fVar124 - (float)local_358._0_4_ * fVar72;
      auVar136._4_4_ = fVar102 * fVar161 - (float)local_358._4_4_ * fVar103;
      auVar136._8_4_ = fStack_430 * fVar164 - fStack_350 * fVar122;
      auVar136._12_4_ = fStack_42c * fVar165 - fStack_34c * fVar123;
      auVar327._0_4_ = local_288._0_4_ * fVar72;
      auVar327._4_4_ = local_288._4_4_ * fVar103;
      auVar327._8_4_ = local_288._8_4_ * fVar122;
      auVar327._12_4_ = fVar123 * 0.0;
      auVar209._0_8_ =
           CONCAT44(local_d8._4_4_ * fVar161 - auVar327._4_4_,
                    local_d8._0_4_ * fVar124 - auVar327._0_4_);
      auVar209._8_4_ = local_d8._8_4_ * fVar164 - auVar327._8_4_;
      auVar209._12_4_ = fVar165 * 0.0 - auVar327._12_4_;
      auVar151._0_4_ = fStack_294 * fVar124 - fStack_2a4 * fVar72;
      auVar151._4_4_ = fStack_290 * fVar161 - fStack_2a0 * fVar103;
      auVar151._8_4_ = fStack_28c * fVar164 - fStack_29c * fVar122;
      auVar151._12_4_ = fVar165 * 0.0 - fVar123 * 0.0;
      auVar319._0_8_ =
           CONCAT44(fVar254 * fVar161 - fVar143 * fVar103,fVar241 * fVar124 - fVar141 * fVar72);
      auVar319._8_4_ = fVar257 * fVar164 - fVar159 * fVar122;
      auVar319._12_4_ = fVar317 * fVar165 - fVar160 * fVar123;
      auVar162._0_4_ = local_108 * fVar124 - local_368 * fVar72;
      auVar162._4_4_ = fStack_104 * fVar161 - fStack_364 * fVar103;
      auVar162._8_4_ = fStack_100 * fVar164 - fStack_360 * fVar122;
      auVar162._12_4_ = fStack_fc * fVar165 - fStack_35c * fVar123;
      auVar290._0_8_ =
           CONCAT44(local_128._4_4_ * fVar161 - local_138._4_4_ * fVar103,
                    local_128._0_4_ * fVar124 - local_138._0_4_ * fVar72);
      auVar290._8_4_ = local_128._8_4_ * fVar164 - local_138._8_4_ * fVar122;
      auVar290._12_4_ = fVar165 * 0.0 - fVar123 * 0.0;
      auVar270._0_4_ = fVar124 * fVar254 - fVar72 * fVar143;
      auVar270._4_4_ = fVar161 * fVar257 - fVar103 * fVar159;
      auVar270._8_4_ = fVar164 * fVar317 - fVar122 * fVar160;
      auVar270._12_4_ = fVar165 * 0.0 - fVar123 * 0.0;
      auVar96._8_4_ = auVar335._8_4_;
      auVar96._0_8_ = auVar335._0_8_;
      auVar96._12_4_ = auVar335._12_4_;
      auVar73 = minps(auVar96,auVar136);
      auVar117 = maxps(auVar335,auVar136);
      auVar137._8_4_ = auVar209._8_4_;
      auVar137._0_8_ = auVar209._0_8_;
      auVar137._12_4_ = auVar209._12_4_;
      auVar126 = minps(auVar137,auVar151);
      auVar73 = minps(auVar73,auVar126);
      auVar126 = maxps(auVar209,auVar151);
      auVar326 = maxps(auVar117,auVar126);
      auVar138._8_4_ = auVar319._8_4_;
      auVar138._0_8_ = auVar319._0_8_;
      auVar138._12_4_ = auVar319._12_4_;
      auVar126 = minps(auVar138,auVar162);
      auVar128 = maxps(auVar319,auVar162);
      auVar152._8_4_ = auVar290._8_4_;
      auVar152._0_8_ = auVar290._0_8_;
      auVar152._12_4_ = auVar290._12_4_;
      auVar117 = minps(auVar152,auVar270);
      auVar126 = minps(auVar126,auVar117);
      auVar73 = minps(auVar73,auVar126);
      auVar126 = maxps(auVar290,auVar270);
      auVar126 = maxps(auVar128,auVar126);
      auVar126 = maxps(auVar326,auVar126);
      auVar336._0_4_ =
           -(uint)(local_158 <= auVar126._0_4_ && auVar73._0_4_ <= local_148) & auVar184._0_4_;
      auVar336._4_4_ =
           -(uint)(fStack_154 <= auVar126._4_4_ && auVar73._4_4_ <= fStack_144) & auVar184._4_4_;
      auVar336._8_4_ =
           -(uint)(fStack_150 <= auVar126._8_4_ && auVar73._8_4_ <= fStack_140) & auVar184._8_4_;
      auVar336._12_4_ =
           -(uint)(fStack_14c <= auVar126._12_4_ && auVar73._12_4_ <= fStack_13c) & auVar184._12_4_;
      uVar67 = movmskps(0,auVar336);
      uVar57 = (ulong)uVar67;
    }
    if ((uint)uVar57 != 0) {
      auStack_1f8[uVar56] = (uint)uVar57;
      *(undefined8 *)(afStack_78 + uVar56 * 2) = local_388;
      auStack_58[uVar56] = local_428;
      uVar56 = (ulong)((int)uVar56 + 1);
    }
    do {
      if ((int)uVar56 == 0) {
        if (local_43c != 0) {
          return local_43d;
        }
        fVar142 = ray->tfar;
        auVar121._4_4_ = -(uint)(fStack_174 <= fVar142);
        auVar121._0_4_ = -(uint)(local_178 <= fVar142);
        auVar121._8_4_ = -(uint)(fStack_170 <= fVar142);
        auVar121._12_4_ = -(uint)(fStack_16c <= fVar142);
        uVar67 = movmskps((int)uVar57,auVar121);
        uVar66 = uVar66 & (uint)local_2f0 & uVar67;
        local_43d = uVar66 != 0;
        if (!local_43d) {
          return local_43d;
        }
        goto LAB_00c12940;
      }
      uVar69 = (int)uVar56 - 1;
      uVar58 = (ulong)uVar69;
      uVar67 = auStack_1f8[uVar58];
      local_428 = auStack_58[uVar58];
      uVar57 = 0;
      if (uVar67 != 0) {
        for (; (uVar67 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
        }
      }
      uVar67 = uVar67 - 1 & uVar67;
      auStack_1f8[uVar58] = uVar67;
      if (uVar67 == 0) {
        uVar56 = (ulong)uVar69;
      }
      uVar61 = uVar57 + 1;
      uVar62 = uVar61;
      if ((long)uVar61 < 0) {
        uVar62 = (ulong)((uint)uVar61 & 1) | uVar61 >> 1;
      }
      fVar72 = afStack_78[uVar58 * 2];
      fVar101 = *(float *)((long)auStack_58 + uVar58 * 8 + -0x1c);
      fVar102 = fVar72 * (1.0 - (float)uVar57 * 0.33333334) + fVar101 * (float)uVar57 * 0.33333334;
      fVar103 = fVar72 * (1.0 - (float)uVar61 * 0.33333334) + fVar101 * (float)uVar61 * 0.33333334;
      fVar122 = fVar72 * 0.0 + fVar101 * 0.0;
      fVar101 = fVar72 * 0.0 + fVar101 * 0.0;
      fVar72 = fVar103 - fVar102;
      local_388 = CONCAT44(fVar103,fVar102);
      uStack_380 = CONCAT44(fVar101,fVar122);
      if (0.16666667 <= fVar72) break;
      fVar123 = (float)local_428;
      fVar124 = (float)((ulong)local_428 >> 0x20);
      fVar141 = 1.0 - fVar123;
      fVar143 = 1.0 - fVar123;
      fVar189 = 1.0 - fVar124;
      fVar190 = 1.0 - fVar124;
      fVar159 = (float)local_208 * fVar141 + (float)local_248 * fVar123;
      fVar160 = local_208._4_4_ * fVar143 + local_248._4_4_ * fVar123;
      fVar161 = (float)uStack_200 * fVar189 + (float)uStack_240 * fVar124;
      fVar164 = uStack_200._4_4_ * fVar190 + uStack_240._4_4_ * fVar124;
      fVar191 = (float)local_218 * fVar141 + (float)local_258 * fVar123;
      fVar201 = local_218._4_4_ * fVar143 + local_258._4_4_ * fVar123;
      fVar202 = (float)uStack_210 * fVar189 + (float)uStack_250 * fVar124;
      fVar203 = uStack_210._4_4_ * fVar190 + uStack_250._4_4_ * fVar124;
      fVar212 = (float)local_228 * fVar141 + (float)local_268 * fVar123;
      fVar241 = local_228._4_4_ * fVar143 + local_268._4_4_ * fVar123;
      fVar257 = (float)uStack_220 * fVar189 + (float)uStack_260 * fVar124;
      fVar214 = uStack_220._4_4_ * fVar190 + uStack_260._4_4_ * fVar124;
      fVar165 = (fVar141 * (float)local_238 + fVar123 * (float)local_278) - fVar212;
      fVar166 = (fVar143 * local_238._4_4_ + fVar123 * local_278._4_4_) - fVar241;
      fVar189 = (fVar189 * (float)uStack_230 + fVar124 * (float)uStack_270) - fVar257;
      fVar190 = (fVar190 * uStack_230._4_4_ + fVar124 * uStack_270._4_4_) - fVar214;
      fVar123 = fVar102 * (fVar212 - fVar191) + fVar191;
      fVar124 = fVar102 * (fVar241 - fVar201) + fVar201;
      fVar141 = fVar102 * (fVar257 - fVar202) + fVar202;
      fVar143 = fVar102 * (fVar214 - fVar203) + fVar203;
      fVar213 = (fVar212 - fVar191) * fVar103 + fVar191;
      fVar254 = (fVar241 - fVar201) * fVar103 + fVar201;
      fVar317 = (fVar257 - fVar202) * fVar103 + fVar202;
      fVar225 = (fVar214 - fVar203) * fVar103 + fVar203;
      fVar230 = fVar102 * (fVar191 - fVar159) + fVar159;
      fVar262 = fVar102 * (fVar201 - fVar160) + fVar160;
      fVar273 = fVar102 * (fVar202 - fVar161) + fVar161;
      fVar276 = fVar102 * (fVar203 - fVar164) + fVar164;
      fVar230 = (fVar123 - fVar230) * fVar102 + fVar230;
      fVar262 = (fVar124 - fVar262) * fVar102 + fVar262;
      fVar273 = (fVar141 - fVar273) * fVar102 + fVar273;
      fVar276 = (fVar143 - fVar276) * fVar102 + fVar276;
      fVar123 = (((fVar102 * fVar165 + fVar212) - fVar123) * fVar102 + fVar123) - fVar230;
      fVar124 = (((fVar102 * fVar166 + fVar241) - fVar124) * fVar102 + fVar124) - fVar262;
      fVar141 = (((fVar102 * fVar189 + fVar257) - fVar141) * fVar102 + fVar141) - fVar273;
      fVar143 = (((fVar102 * fVar190 + fVar214) - fVar143) * fVar102 + fVar143) - fVar276;
      auVar97._0_4_ = fVar102 * fVar123 + fVar230;
      auVar97._4_4_ = fVar102 * fVar124 + fVar262;
      auVar97._8_4_ = fVar102 * fVar141 + fVar273;
      auVar97._12_4_ = fVar102 * fVar143 + fVar276;
      fVar159 = (fVar191 - fVar159) * fVar103 + fVar159;
      fVar160 = (fVar201 - fVar160) * fVar103 + fVar160;
      fVar161 = (fVar202 - fVar161) * fVar103 + fVar161;
      fVar164 = (fVar203 - fVar164) * fVar103 + fVar164;
      fVar159 = (fVar213 - fVar159) * fVar103 + fVar159;
      fVar160 = (fVar254 - fVar160) * fVar103 + fVar160;
      fVar161 = (fVar317 - fVar161) * fVar103 + fVar161;
      fVar164 = (fVar225 - fVar164) * fVar103 + fVar164;
      fVar191 = (((fVar165 * fVar103 + fVar212) - fVar213) * fVar103 + fVar213) - fVar159;
      fVar201 = (((fVar166 * fVar103 + fVar241) - fVar254) * fVar103 + fVar254) - fVar160;
      fVar202 = (((fVar189 * fVar103 + fVar257) - fVar317) * fVar103 + fVar317) - fVar161;
      fVar203 = (((fVar190 * fVar103 + fVar214) - fVar225) * fVar103 + fVar225) - fVar164;
      fVar159 = fVar103 * fVar191 + fVar159;
      fVar160 = fVar103 * fVar201 + fVar160;
      fVar161 = fVar103 * fVar202 + fVar161;
      fVar164 = fVar103 * fVar203 + fVar164;
      fVar212 = fVar72 * 0.33333334;
      fVar165 = fVar123 * 3.0 * fVar212 + auVar97._0_4_;
      fVar166 = fVar124 * 3.0 * fVar212 + auVar97._4_4_;
      fVar189 = fVar141 * 3.0 * fVar212 + auVar97._8_4_;
      fVar190 = fVar143 * 3.0 * fVar212 + auVar97._12_4_;
      fVar191 = fVar159 - fVar212 * fVar191 * 3.0;
      fVar201 = fVar160 - fVar212 * fVar201 * 3.0;
      fVar202 = fVar161 - fVar212 * fVar202 * 3.0;
      fVar203 = fVar164 - fVar212 * fVar203 * 3.0;
      auVar23._4_8_ = auVar327._8_8_;
      auVar23._0_4_ = auVar97._4_4_;
      auVar328._0_8_ = auVar23._0_8_ << 0x20;
      auVar328._8_4_ = auVar97._8_4_;
      auVar328._12_4_ = auVar97._12_4_;
      auVar329._8_8_ = auVar97._8_8_;
      auVar329._0_8_ = auVar328._8_8_;
      fVar254 = (fVar161 - fVar159) + (auVar97._8_4_ - auVar97._0_4_);
      fVar257 = (fVar164 - fVar160) + (auVar97._12_4_ - auVar97._4_4_);
      auVar217._0_4_ = fVar257 * fVar160;
      auVar217._4_4_ = fVar257 * fVar160;
      auVar217._8_4_ = fVar257 * fVar164;
      auVar217._12_4_ = fVar257 * fVar164;
      fVar123 = auVar97._0_4_ * fVar254 + auVar97._4_4_ * fVar257;
      fVar124 = auVar97._8_4_ * fVar254 + auVar97._12_4_ * fVar257;
      fVar317 = fVar165 * fVar254 + fVar166 * fVar257;
      fVar214 = fVar189 * fVar254 + fVar190 * fVar257;
      fVar212 = fVar191 * fVar254 + fVar201 * fVar257;
      auVar248._4_4_ = fVar201 * fVar254 + fVar201 * fVar257;
      auVar248._0_4_ = fVar212;
      fVar213 = fVar202 * fVar254 + fVar203 * fVar257;
      fVar141 = fVar254 * fVar159 + auVar217._0_4_;
      fVar241 = fVar254 * fVar161 + auVar217._8_4_;
      auVar24._4_8_ = auVar217._8_8_;
      auVar24._0_4_ = fVar166 * fVar254 + fVar166 * fVar257;
      auVar218._0_8_ = auVar24._0_8_ << 0x20;
      auVar218._8_4_ = fVar214;
      auVar218._12_4_ = fVar190 * fVar254 + fVar190 * fVar257;
      fVar143 = fVar317;
      if (fVar317 <= fVar123) {
        fVar143 = fVar123;
        fVar123 = fVar317;
      }
      auVar219._8_8_ = auVar218._8_8_;
      auVar219._0_8_ = auVar219._8_8_;
      auVar248._8_4_ = fVar213;
      auVar248._12_4_ = fVar203 * fVar254 + fVar203 * fVar257;
      if (fVar141 <= fVar212) {
        auVar248._0_4_ = fVar141;
      }
      if (auVar248._0_4_ <= fVar123) {
        fVar123 = auVar248._0_4_;
      }
      auVar25._4_8_ = auVar248._8_8_;
      auVar25._0_4_ = fVar254 * fVar160 + auVar217._4_4_;
      auVar249._0_8_ = auVar25._0_8_ << 0x20;
      auVar249._8_4_ = fVar241;
      auVar249._12_4_ = fVar254 * fVar164 + auVar217._12_4_;
      if (fVar141 <= fVar212) {
        fVar141 = fVar212;
      }
      auVar250._8_8_ = auVar249._8_8_;
      auVar250._0_8_ = auVar250._8_8_;
      if (fVar141 <= fVar143) {
        fVar141 = fVar143;
      }
      if (fVar214 <= fVar124) {
        auVar219._0_4_ = fVar124;
        fVar124 = fVar214;
      }
      fVar143 = fVar213;
      if (fVar241 <= fVar213) {
        fVar143 = fVar241;
      }
      if (fVar143 <= fVar124) {
        fVar124 = fVar143;
      }
      if (fVar241 <= fVar213) {
        auVar250._0_4_ = fVar213;
      }
      if (auVar250._0_4_ <= auVar219._0_4_) {
        auVar250._0_4_ = auVar219._0_4_;
      }
      uVar62 = CONCAT71((int7)(uVar62 >> 8),fVar72 < 0.001);
      bVar65 = 3 < (uint)uVar56;
      uVar26 = (undefined3)(uVar69 >> 8);
      uVar57 = (ulong)CONCAT31(uVar26,bVar65);
      fVar143 = auVar250._0_4_;
      if ((0.0001 <= fVar123) || (fVar143 <= -0.0001)) {
        if ((-0.0001 < fVar141 && fVar124 < 0.0001) ||
           ((fVar123 < 0.0001 && -0.0001 < fVar141 || (fVar124 < 0.0001 && -0.0001 < fVar143))))
        goto LAB_00c140a5;
        bVar19 = true;
        auVar327 = auVar329;
      }
      else {
LAB_00c140a5:
        local_428 = CONCAT44(fVar164,fVar161);
        bVar65 = bVar65 || fVar72 < 0.001;
        uVar57 = (ulong)CONCAT31(uVar26,bVar65);
        fVar241 = (float)(~-(uint)(fVar123 < 0.0) & 0x3f800000 | -(uint)(fVar123 < 0.0) & 0xbf800000
                         );
        fVar213 = (float)(~-(uint)(fVar141 < 0.0) & 0x3f800000 | -(uint)(fVar141 < 0.0) & 0xbf800000
                         );
        fVar212 = 0.0;
        if ((fVar241 == fVar213) && (!NAN(fVar241) && !NAN(fVar213))) {
          fVar212 = INFINITY;
        }
        fVar254 = 0.0;
        if ((fVar241 == fVar213) && (!NAN(fVar241) && !NAN(fVar213))) {
          fVar254 = -INFINITY;
        }
        fVar257 = (float)(~-(uint)(fVar124 < 0.0) & 0x3f800000 | -(uint)(fVar124 < 0.0) & 0xbf800000
                         );
        if ((fVar241 != fVar257) || (fVar317 = fVar254, NAN(fVar241) || NAN(fVar257))) {
          if ((fVar124 != fVar123) || (NAN(fVar124) || NAN(fVar123))) {
            fVar124 = -fVar123 / (fVar124 - fVar123);
            fVar124 = (1.0 - fVar124) * 0.0 + fVar124;
            fVar317 = fVar124;
          }
          else {
            fVar124 = INFINITY;
            if ((fVar123 == 0.0) && (fVar124 = INFINITY, !NAN(fVar123))) {
              fVar124 = 0.0;
            }
            fVar317 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar123 == 0.0) & 1) * 4);
          }
          if (fVar124 <= fVar212) {
            fVar212 = fVar124;
          }
          if (fVar317 <= fVar254) {
            fVar317 = fVar254;
          }
        }
        uVar62 = (ulong)(fVar143 < 0.0);
        fVar123 = *(float *)(&DAT_01ff1ecc + uVar62 * 4);
        if ((fVar213 != fVar123) || (fVar124 = fVar317, NAN(fVar213) || NAN(fVar123))) {
          if ((fVar143 != fVar141) || (NAN(fVar143) || NAN(fVar141))) {
            fVar143 = -fVar141 / (fVar143 - fVar141);
            fVar143 = (1.0 - fVar143) * 0.0 + fVar143;
            fVar124 = fVar143;
          }
          else {
            fVar143 = INFINITY;
            if ((fVar141 == 0.0) && (fVar143 = INFINITY, !NAN(fVar141))) {
              fVar143 = 0.0;
            }
            uVar62 = (ulong)(-(uint)(fVar141 == 0.0) & 1);
            fVar124 = *(float *)(&DAT_01ff1ec4 + uVar62 * 4);
          }
          if (fVar143 <= fVar212) {
            fVar212 = fVar143;
          }
          if (fVar124 <= fVar317) {
            fVar124 = fVar317;
          }
        }
        if ((fVar257 != fVar123) || (NAN(fVar257) || NAN(fVar123))) {
          fVar212 = (float)(~-(uint)(fVar212 < 1.0) & 0x3f800000 |
                           (uint)fVar212 & -(uint)(fVar212 < 1.0));
          fVar124 = (float)(~-(uint)(fVar124 < 1.0) & (uint)fVar124 |
                           -(uint)(fVar124 < 1.0) & 0x3f800000);
        }
        fVar141 = SUB164(ZEXT816(0x3f80000000000000),4);
        uVar67 = -(uint)(fVar124 < fVar141);
        fVar212 = (float)(~-(uint)(fVar212 < 0.0) & (uint)fVar212);
        fVar123 = (float)(~uVar67 & 0x3f800000 | (uint)fVar124 & uVar67);
        bVar19 = true;
        auVar327 = ZEXT816(0x3f80000000000000);
        _local_358 = auVar329;
        if (fVar212 <= fVar123) {
          fVar212 = fVar212 + -0.1;
          fVar123 = fVar123 + 0.1;
          uVar67 = -(uint)(fVar123 < fVar141);
          fVar212 = (float)(~-(uint)(fVar212 < 0.0) & (uint)fVar212);
          fVar225 = (float)(~uVar67 & 0x3f800000 | (uint)fVar123 & uVar67);
          fVar254 = 1.0 - fVar212;
          fVar257 = 1.0 - fVar212;
          fVar317 = 1.0 - fVar225;
          fVar214 = 1.0 - fVar225;
          fVar123 = auVar97._0_4_ * fVar254 + auVar97._8_4_ * fVar212;
          fVar124 = auVar97._4_4_ * fVar257 + auVar97._12_4_ * fVar212;
          fVar141 = auVar97._0_4_ * fVar317 + auVar97._8_4_ * fVar225;
          fVar143 = auVar97._4_4_ * fVar214 + auVar97._12_4_ * fVar225;
          fVar213 = fVar165 * fVar254 + fVar189 * fVar212;
          fVar241 = fVar166 * fVar257 + fVar190 * fVar212;
          fVar165 = fVar165 * fVar317 + fVar189 * fVar225;
          fVar166 = fVar166 * fVar214 + fVar190 * fVar225;
          fVar189 = fVar191 * fVar254 + fVar202 * fVar212;
          fVar190 = fVar201 * fVar257 + fVar203 * fVar212;
          fVar191 = fVar191 * fVar317 + fVar202 * fVar225;
          fVar201 = fVar201 * fVar214 + fVar203 * fVar225;
          fVar202 = fVar254 * fVar159 + fVar161 * fVar212;
          fVar203 = fVar257 * fVar160 + fVar164 * fVar212;
          fVar159 = fVar317 * fVar159 + fStack_430 * fVar225;
          fVar160 = fVar214 * fVar160 + fStack_42c * fVar225;
          fVar311 = fVar161 * (1.0 - fVar212) + fVar164 * fVar212;
          fStack_42c = fVar161 * (1.0 - fVar225) + fVar164 * fVar225;
          fVar72 = 1.0 / fVar72;
          auVar119._0_4_ = fVar159 - fVar202;
          auVar119._4_4_ = fVar160 - fVar203;
          auVar119._8_4_ = fVar159 - fVar159;
          auVar119._12_4_ = fVar160 - fVar160;
          auVar153._0_8_ = CONCAT44(fVar201 - fVar190,fVar191 - fVar189);
          auVar153._8_4_ = fVar191 - fVar191;
          auVar153._12_4_ = fVar201 - fVar201;
          auVar271._0_4_ = fVar165 - fVar213;
          auVar271._4_4_ = fVar166 - fVar241;
          auVar271._8_4_ = fVar165 - fVar165;
          auVar271._12_4_ = fVar166 - fVar166;
          auVar210._0_8_ = CONCAT44((fVar241 - fVar124) * 3.0,(fVar213 - fVar123) * 3.0);
          auVar210._8_4_ = (fVar165 - fVar141) * 3.0;
          auVar210._12_4_ = (fVar166 - fVar143) * 3.0;
          auVar185._0_8_ = CONCAT44((fVar190 - fVar241) * 3.0,(fVar189 - fVar213) * 3.0);
          auVar185._8_4_ = (fVar191 - fVar165) * 3.0;
          auVar185._12_4_ = (fVar201 - fVar166) * 3.0;
          auVar251._0_4_ = (fVar202 - fVar189) * 3.0;
          auVar251._4_4_ = (fVar203 - fVar190) * 3.0;
          auVar251._8_4_ = (fVar159 - fVar191) * 3.0;
          auVar251._12_4_ = (fVar160 - fVar201) * 3.0;
          auVar193._8_4_ = auVar185._8_4_;
          auVar193._0_8_ = auVar185._0_8_;
          auVar193._12_4_ = auVar185._12_4_;
          auVar126 = minps(auVar193,auVar251);
          auVar73 = maxps(auVar185,auVar251);
          auVar220._8_4_ = auVar210._8_4_;
          auVar220._0_8_ = auVar210._0_8_;
          auVar220._12_4_ = auVar210._12_4_;
          auVar128 = minps(auVar220,auVar126);
          auVar117 = maxps(auVar210,auVar73);
          auVar27._4_8_ = auVar73._8_8_;
          auVar27._0_4_ = auVar128._4_4_;
          auVar186._0_8_ = auVar27._0_8_ << 0x20;
          auVar186._8_4_ = auVar128._8_4_;
          auVar186._12_4_ = auVar128._12_4_;
          auVar187._8_8_ = auVar128._8_8_;
          auVar187._0_8_ = auVar186._8_8_;
          auVar28._4_8_ = auVar126._8_8_;
          auVar28._0_4_ = auVar117._4_4_;
          auVar194._0_8_ = auVar28._0_8_ << 0x20;
          auVar194._8_4_ = auVar117._8_4_;
          auVar194._12_4_ = auVar117._12_4_;
          auVar195._8_8_ = auVar117._8_8_;
          auVar195._0_8_ = auVar194._8_8_;
          auVar126 = minps(auVar128,auVar187);
          auVar73 = maxps(auVar117,auVar195);
          fVar225 = auVar126._0_4_ * fVar72;
          fVar230 = auVar126._4_4_ * fVar72;
          fVar262 = auVar126._8_4_ * fVar72;
          fVar273 = auVar126._12_4_ * fVar72;
          fVar191 = fVar72 * auVar73._0_4_;
          fVar202 = fVar72 * auVar73._4_4_;
          fVar212 = fVar72 * auVar73._8_4_;
          fVar72 = fVar72 * auVar73._12_4_;
          fVar317 = 1.0 / (fStack_42c - fVar311);
          auVar139._0_8_ = CONCAT44(fVar143 - fVar124,fVar141 - fVar123);
          auVar139._8_4_ = fVar141 - fVar141;
          auVar139._12_4_ = fVar143 - fVar143;
          auVar196._8_4_ = auVar139._8_4_;
          auVar196._0_8_ = auVar139._0_8_;
          auVar196._12_4_ = auVar139._12_4_;
          auVar117 = minps(auVar196,auVar271);
          auVar126 = maxps(auVar139,auVar271);
          auVar98._8_4_ = auVar153._8_4_;
          auVar98._0_8_ = auVar153._0_8_;
          auVar98._12_4_ = auVar153._12_4_;
          auVar73 = minps(auVar98,auVar119);
          auVar117 = minps(auVar117,auVar73);
          auVar73 = maxps(auVar153,auVar119);
          auVar73 = maxps(auVar126,auVar73);
          fVar254 = auVar117._0_4_ * fVar317;
          fVar257 = auVar117._4_4_ * fVar317;
          fVar214 = fVar317 * auVar73._0_4_;
          fVar317 = fVar317 * auVar73._4_4_;
          local_428 = CONCAT44(fStack_42c,fVar311);
          auVar188._4_4_ = fStack_42c;
          auVar188._0_4_ = fVar103;
          auVar188._8_4_ = fVar122;
          auVar188._12_4_ = fVar101;
          fVar123 = (fVar102 + fVar103) * 0.5;
          fVar124 = (fVar311 + fStack_42c) * 0.5;
          fVar141 = (fVar103 + fVar122) * 0.0;
          fVar143 = (fStack_42c + fVar101) * 0.0;
          fVar159 = local_88 * fVar123 + local_318;
          fVar161 = fStack_84 * fVar123 + fStack_314;
          fVar160 = fStack_80 * fVar123 + fStack_310;
          fVar164 = fStack_7c * fVar123 + fStack_30c;
          fVar165 = local_98 * fVar123 + (float)local_328._0_4_;
          fVar166 = fStack_94 * fVar123 + (float)local_328._4_4_;
          fVar189 = fStack_90 * fVar123 + fStack_320;
          fVar190 = fStack_8c * fVar123 + fStack_31c;
          fVar159 = (fVar165 - fVar159) * fVar123 + fVar159;
          fVar161 = (fVar166 - fVar161) * fVar123 + fVar161;
          fVar160 = (fVar189 - fVar160) * fVar123 + fVar160;
          fVar164 = (fVar190 - fVar164) * fVar123 + fVar164;
          fVar165 = (((local_a8 * fVar123 + (float)local_338) - fVar165) * fVar123 + fVar165) -
                    fVar159;
          fVar166 = (((fStack_a4 * fVar123 + local_338._4_4_) - fVar166) * fVar123 + fVar166) -
                    fVar161;
          fVar189 = (((fStack_a0 * fVar123 + (float)uStack_330) - fVar189) * fVar123 + fVar189) -
                    fVar160;
          fVar190 = (((fStack_9c * fVar123 + uStack_330._4_4_) - fVar190) * fVar123 + fVar190) -
                    fVar164;
          fVar159 = fVar123 * fVar165 + fVar159;
          fVar161 = fVar123 * fVar166 + fVar161;
          fVar165 = fVar165 * 3.0;
          fVar166 = fVar166 * 3.0;
          fVar160 = (fVar123 * fVar189 + fVar160) - fVar159;
          fVar164 = (fVar123 * fVar190 + fVar164) - fVar161;
          fVar165 = (fVar189 * 3.0 - fVar165) * fVar124 + fVar165;
          fVar166 = (fVar190 * 3.0 - fVar166) * fVar124 + fVar166;
          auVar120._0_8_ = CONCAT44(fVar165,fVar160) ^ 0x80000000;
          auVar120._8_4_ = fVar165;
          auVar120._12_4_ = fVar165;
          fVar276 = fVar102 - fVar123;
          fVar281 = fVar311 - fVar124;
          fVar292 = fVar103 - fVar141;
          fVar295 = fStack_42c - fVar143;
          fVar298 = fVar103 - fVar123;
          fVar301 = fStack_42c - fVar124;
          fVar122 = fVar122 - fVar141;
          fVar101 = fVar101 - fVar143;
          fVar159 = fVar160 * fVar124 + fVar159;
          fVar161 = fVar164 * fVar124 + fVar161;
          auVar140._0_8_ = CONCAT44(fVar166,fVar164) ^ 0x8000000000000000;
          auVar140._8_4_ = -fVar166;
          auVar140._12_4_ = -fVar166;
          auVar308._0_4_ = fVar164 * fVar165 - fVar166 * fVar160;
          auVar308._4_4_ = auVar308._0_4_;
          auVar308._8_4_ = auVar308._0_4_;
          auVar308._12_4_ = auVar308._0_4_;
          auVar126 = divps(auVar140,auVar308);
          auVar73 = divps(auVar120,auVar308);
          fVar165 = auVar126._0_4_;
          fVar166 = auVar126._4_4_;
          fVar160 = auVar73._0_4_;
          fVar164 = auVar73._4_4_;
          fVar123 = fVar123 - (fVar161 * fVar160 + fVar159 * fVar165);
          fVar141 = fVar124 - (fVar161 * fVar164 + fVar159 * fVar166);
          fVar143 = fVar124 - (fVar161 * auVar73._8_4_ + fVar159 * auVar126._8_4_);
          fVar124 = fVar124 - (fVar161 * auVar73._12_4_ + fVar159 * auVar126._12_4_);
          auVar330._0_8_ = CONCAT44(fVar166 * fVar254,fVar166 * fVar225);
          auVar330._8_4_ = fVar166 * fVar230;
          auVar330._12_4_ = fVar166 * fVar257;
          auVar252._0_4_ = fVar166 * fVar191;
          auVar252._4_4_ = fVar166 * fVar214;
          auVar252._8_4_ = fVar166 * fVar202;
          auVar252._12_4_ = fVar166 * fVar317;
          auVar337._8_4_ = auVar330._8_4_;
          auVar337._0_8_ = auVar330._0_8_;
          auVar337._12_4_ = auVar330._12_4_;
          auVar128 = minps(auVar337,auVar252);
          auVar126 = maxps(auVar252,auVar330);
          auVar154._0_8_ = CONCAT44(fVar164 * fVar257,fVar164 * fVar230);
          auVar154._8_4_ = fVar164 * fVar262;
          auVar154._12_4_ = fVar164 * fVar273;
          auVar331._0_4_ = fVar164 * fVar202;
          auVar331._4_4_ = fVar164 * fVar317;
          auVar331._8_4_ = fVar164 * fVar212;
          auVar331._12_4_ = fVar164 * fVar72;
          auVar221._8_4_ = auVar154._8_4_;
          auVar221._0_8_ = auVar154._0_8_;
          auVar221._12_4_ = auVar154._12_4_;
          auVar73 = minps(auVar221,auVar331);
          auVar117 = maxps(auVar331,auVar154);
          fVar159 = 0.0 - (auVar117._0_4_ + auVar126._0_4_);
          fVar161 = 1.0 - (auVar117._4_4_ + auVar126._4_4_);
          fVar189 = 0.0 - (auVar117._8_4_ + auVar126._8_4_);
          fVar190 = 0.0 - (auVar117._12_4_ + auVar126._12_4_);
          fVar201 = 0.0 - (auVar73._0_4_ + auVar128._0_4_);
          fVar203 = 1.0 - (auVar73._4_4_ + auVar128._4_4_);
          fVar213 = 0.0 - (auVar73._8_4_ + auVar128._8_4_);
          fVar241 = 0.0 - (auVar73._12_4_ + auVar128._12_4_);
          auVar253._0_8_ = CONCAT44(fVar281 * fVar161,fVar276 * fVar159);
          auVar253._8_4_ = fVar292 * fVar189;
          auVar253._12_4_ = fVar295 * fVar190;
          auVar309._0_8_ = CONCAT44(fVar254 * fVar165,fVar225 * fVar165);
          auVar309._8_4_ = fVar230 * fVar165;
          auVar309._12_4_ = fVar257 * fVar165;
          auVar222._0_4_ = fVar165 * fVar191;
          auVar222._4_4_ = fVar165 * fVar214;
          auVar222._8_4_ = fVar165 * fVar202;
          auVar222._12_4_ = fVar165 * fVar317;
          auVar320._8_4_ = auVar309._8_4_;
          auVar320._0_8_ = auVar309._0_8_;
          auVar320._12_4_ = auVar309._12_4_;
          auVar126 = minps(auVar320,auVar222);
          auVar73 = maxps(auVar222,auVar309);
          auVar197._0_8_ = CONCAT44(fVar257 * fVar160,fVar230 * fVar160);
          auVar197._8_4_ = fVar262 * fVar160;
          auVar197._12_4_ = fVar273 * fVar160;
          auVar332._0_4_ = fVar160 * fVar202;
          auVar332._4_4_ = fVar160 * fVar317;
          auVar332._8_4_ = fVar160 * fVar212;
          auVar332._12_4_ = fVar160 * fVar72;
          auVar338._8_4_ = auVar197._8_4_;
          auVar338._0_8_ = auVar197._0_8_;
          auVar338._12_4_ = auVar197._12_4_;
          auVar128 = minps(auVar338,auVar332);
          auVar310._0_4_ = fVar276 * fVar201;
          auVar310._4_4_ = fVar281 * fVar203;
          auVar310._8_4_ = fVar292 * fVar213;
          auVar310._12_4_ = fVar295 * fVar241;
          auVar155._0_8_ = CONCAT44(fVar161 * fVar301,fVar159 * fVar298);
          auVar155._8_4_ = fVar189 * fVar122;
          auVar155._12_4_ = fVar190 * fVar101;
          auVar163._0_4_ = fVar201 * fVar298;
          auVar163._4_4_ = fVar203 * fVar301;
          auVar163._8_4_ = fVar213 * fVar122;
          auVar163._12_4_ = fVar241 * fVar101;
          auVar117 = maxps(auVar332,auVar197);
          auVar327._0_4_ = auVar117._0_4_ + auVar73._0_4_;
          auVar327._4_4_ = auVar117._4_4_ + auVar73._4_4_;
          auVar327._8_4_ = auVar117._8_4_ + auVar73._8_4_;
          auVar327._12_4_ = auVar117._12_4_ + auVar73._12_4_;
          fVar72 = 1.0 - (auVar128._0_4_ + auVar126._0_4_);
          fVar159 = 0.0 - (auVar128._4_4_ + auVar126._4_4_);
          fVar161 = 0.0 - (auVar128._8_4_ + auVar126._8_4_);
          fVar189 = 0.0 - (auVar128._12_4_ + auVar126._12_4_);
          auVar223._0_8_ =
               CONCAT44(fVar281 * (0.0 - auVar327._4_4_),fVar276 * (1.0 - auVar327._0_4_));
          auVar223._8_4_ = fVar292 * (0.0 - auVar327._8_4_);
          auVar223._12_4_ = fVar295 * (0.0 - auVar327._12_4_);
          auVar272._0_4_ = fVar276 * fVar72;
          auVar272._4_4_ = fVar281 * fVar159;
          auVar272._8_4_ = fVar292 * fVar161;
          auVar272._12_4_ = fVar295 * fVar189;
          auVar198._0_8_ =
               CONCAT44((0.0 - auVar327._4_4_) * fVar301,(1.0 - auVar327._0_4_) * fVar298);
          auVar198._8_4_ = (0.0 - auVar327._8_4_) * fVar122;
          auVar198._12_4_ = (0.0 - auVar327._12_4_) * fVar101;
          auVar211._0_4_ = fVar72 * fVar298;
          auVar211._4_4_ = fVar159 * fVar301;
          auVar211._8_4_ = fVar161 * fVar122;
          auVar211._12_4_ = fVar189 * fVar101;
          auVar291._8_4_ = auVar223._8_4_;
          auVar291._0_8_ = auVar223._0_8_;
          auVar291._12_4_ = auVar223._12_4_;
          auVar73 = minps(auVar291,auVar272);
          auVar321._8_4_ = auVar198._8_4_;
          auVar321._0_8_ = auVar198._0_8_;
          auVar321._12_4_ = auVar198._12_4_;
          auVar126 = minps(auVar321,auVar211);
          auVar128 = minps(auVar73,auVar126);
          auVar126 = maxps(auVar272,auVar223);
          auVar73 = maxps(auVar211,auVar198);
          auVar117 = maxps(auVar73,auVar126);
          auVar199._8_4_ = auVar253._8_4_;
          auVar199._0_8_ = auVar253._0_8_;
          auVar199._12_4_ = auVar253._12_4_;
          auVar73 = minps(auVar199,auVar310);
          auVar224._8_4_ = auVar155._8_4_;
          auVar224._0_8_ = auVar155._0_8_;
          auVar224._12_4_ = auVar155._12_4_;
          auVar126 = minps(auVar224,auVar163);
          auVar126 = minps(auVar73,auVar126);
          auVar326 = maxps(auVar310,auVar253);
          auVar73 = maxps(auVar163,auVar155);
          auVar73 = maxps(auVar73,auVar326);
          auVar200._0_4_ = auVar128._4_4_ + auVar128._0_4_ + fVar123;
          auVar200._4_4_ = auVar126._4_4_ + auVar126._0_4_ + fVar141;
          auVar200._8_4_ = auVar128._8_4_ + auVar128._4_4_ + fVar143;
          auVar200._12_4_ = auVar128._12_4_ + auVar126._4_4_ + fVar124;
          fVar72 = auVar117._4_4_ + auVar117._0_4_ + fVar123;
          fVar101 = auVar73._4_4_ + auVar73._0_4_ + fVar141;
          auVar156._4_4_ = fVar101;
          auVar156._0_4_ = fVar72;
          auVar30._4_4_ = fVar311;
          auVar30._0_4_ = fVar102;
          auVar30._8_4_ = fVar103;
          auVar30._12_4_ = fStack_42c;
          auVar126 = maxps(auVar30,auVar200);
          auVar156._8_4_ = auVar117._8_4_ + auVar117._4_4_ + fVar143;
          auVar156._12_4_ = auVar117._12_4_ + auVar73._4_4_ + fVar124;
          auVar73 = minps(auVar156,auVar188);
          iVar60 = -(uint)(auVar73._0_4_ < auVar126._0_4_);
          iVar68 = -(uint)(auVar73._4_4_ < auVar126._4_4_);
          auVar158._4_4_ = iVar68;
          auVar158._0_4_ = iVar60;
          auVar158._8_4_ = iVar68;
          auVar158._12_4_ = iVar68;
          auVar157._8_8_ = auVar158._8_8_;
          auVar157._4_4_ = iVar60;
          auVar157._0_4_ = iVar60;
          uVar67 = movmskpd((int)uVar62,auVar157);
          uVar62 = (ulong)uVar67;
          fStack_430 = fVar103;
          if (uVar67 == 0) {
            uVar62 = 0;
            if (auVar200._0_4_ <= fVar102) {
              auVar327._0_12_ = ZEXT812(0x40400000);
              auVar327._12_4_ = 0.0;
              auVar339._4_4_ = fStack_314;
              auVar339._0_4_ = local_318;
              auVar339._8_4_ = fStack_310;
              auVar339._12_4_ = fStack_30c;
            }
            else {
              auVar327._0_12_ = ZEXT812(0x40400000);
              auVar327._12_4_ = 0.0;
              auVar339._4_4_ = fStack_314;
              auVar339._0_4_ = local_318;
              auVar339._8_4_ = fStack_310;
              auVar339._12_4_ = fStack_30c;
              if (fVar72 < fVar103) {
                iVar60 = -(uint)(fVar101 < fStack_42c);
                uVar62 = (ulong)CONCAT11((char)((uint)iVar60 >> 8),
                                         (byte)iVar60 & fVar311 < auVar200._4_4_);
              }
            }
            bVar54 = bVar65 | (byte)uVar62;
            uVar57 = (ulong)CONCAT31(uVar26,bVar54);
            if (bVar54 == 1) {
              uVar57 = 200;
              do {
                fVar101 = 1.0 - fVar123;
                fVar122 = fVar123 * fVar123 * fVar123;
                fVar143 = auVar327._0_4_;
                fVar103 = fVar123 * fVar123 * fVar143 * fVar101;
                fVar72 = fVar101 * fVar101 * fVar101;
                fVar124 = fVar123 * fVar143 * fVar101 * fVar101;
                fVar101 = fVar72 * auVar339._0_4_ +
                          fVar124 * (float)local_328._0_4_ +
                          fVar103 * (float)local_338 + fVar122 * (float)local_b8._0_4_;
                fVar102 = fVar72 * auVar339._4_4_ +
                          fVar124 * (float)local_328._4_4_ +
                          fVar103 * local_338._4_4_ + fVar122 * (float)local_b8._4_4_;
                fVar101 = ((fVar72 * auVar339._8_4_ +
                           fVar124 * fStack_320 + fVar103 * (float)uStack_330 + fVar122 * fStack_b0)
                          - fVar101) * fVar141 + fVar101;
                fVar102 = ((fVar72 * auVar339._12_4_ +
                           fVar124 * fStack_31c + fVar103 * uStack_330._4_4_ + fVar122 * fStack_ac)
                          - fVar102) * fVar141 + fVar102;
                fVar123 = fVar123 - (fVar102 * fVar160 + fVar101 * fVar165);
                fVar141 = fVar141 - (fVar102 * fVar164 + fVar101 * fVar166);
                fVar72 = ABS(fVar102);
                if (ABS(fVar102) <= ABS(fVar101)) {
                  fVar72 = ABS(fVar101);
                }
                if (fVar72 < fVar142) {
                  if ((((0.0 <= fVar123) && (fVar123 <= 1.0)) && (0.0 <= fVar141)) &&
                     (fVar141 <= 1.0)) {
                    fVar72 = (pre->ray_space).vx.field_0.m128[2];
                    fVar101 = (pre->ray_space).vy.field_0.m128[2];
                    fVar102 = (pre->ray_space).vz.field_0.m128[2];
                    fVar103 = (ray->org).field_0.m128[0];
                    fVar122 = (ray->org).field_0.m128[1];
                    fVar124 = (ray->org).field_0.m128[2];
                    fVar165 = 1.0 - fVar141;
                    fVar164 = 1.0 - fVar123;
                    fVar159 = fVar164 * fVar164 * fVar164;
                    fVar160 = fVar123 * fVar143 * fVar164 * fVar164;
                    fVar161 = fVar123 * fVar123 * fVar123;
                    fVar143 = fVar123 * fVar123 * fVar143 * fVar164;
                    fVar72 = (((fStack_390 - fVar124) * fVar102 +
                              (fStack_394 - fVar122) * fVar101 + (local_398 - fVar103) * fVar72) *
                              fVar165 +
                             ((fStack_340 - fVar124) * fVar102 +
                             (fStack_344 - fVar122) * fVar101 + (local_348 - fVar103) * fVar72) *
                             fVar141) * fVar159 +
                             (((fStack_3a0 - fVar124) * fVar102 +
                              (fStack_3a4 - fVar122) * fVar101 + (local_3a8 - fVar103) * fVar72) *
                              fVar165 +
                             ((fStack_3d0 - fVar124) * fVar102 +
                             (fStack_3d4 - fVar122) * fVar101 + (local_3d8 - fVar103) * fVar72) *
                             fVar141) * fVar160 +
                             (((fStack_3c0 - fVar124) * fVar102 +
                              (fStack_3c4 - fVar122) * fVar101 + (local_3c8 - fVar103) * fVar72) *
                              fVar165 +
                             ((fStack_3e0 - fVar124) * fVar102 +
                             (fStack_3e4 - fVar122) * fVar101 + (local_3e8 - fVar103) * fVar72) *
                             fVar141) * fVar143 +
                             (fVar165 * ((fStack_3b0 - fVar124) * fVar102 +
                                        (fStack_3b4 - fVar122) * fVar101 +
                                        (local_3b8 - fVar103) * fVar72) +
                             ((fStack_2b0 - fVar124) * fVar102 +
                             (fStack_2b4 - fVar122) * fVar101 + (local_2b8 - fVar103) * fVar72) *
                             fVar141) * fVar161;
                    if (((ray->org).field_0.m128[3] <= fVar72) &&
                       (fVar101 = ray->tfar, fVar72 <= fVar101)) {
                      fVar124 = 1.0 - fVar141;
                      fVar165 = 1.0 - fVar141;
                      fVar166 = 1.0 - fVar141;
                      fVar102 = local_3a8 * fVar124 + local_3d8 * fVar141;
                      fVar103 = fStack_3a4 * fVar165 + fStack_3d4 * fVar141;
                      fVar122 = fStack_3a0 * fVar166 + fStack_3d0 * fVar141;
                      fVar189 = local_3c8 * fVar124 + local_3e8 * fVar141;
                      fVar191 = fStack_3c4 * fVar165 + fStack_3e4 * fVar141;
                      fVar202 = fStack_3c0 * fVar166 + fStack_3e0 * fVar141;
                      fVar190 = fVar189 - fVar102;
                      fVar201 = fVar191 - fVar103;
                      fVar203 = fVar202 - fVar122;
                      fVar102 = (((fVar102 - (local_398 * fVar124 + local_348 * fVar141)) * fVar164
                                 + fVar123 * fVar190) * fVar164 +
                                (fVar190 * fVar164 +
                                ((fVar124 * local_3b8 + fVar141 * local_2b8) - fVar189) * fVar123) *
                                fVar123) * 3.0;
                      fVar103 = (((fVar103 - (fStack_394 * fVar165 + fStack_344 * fVar141)) *
                                  fVar164 + fVar123 * fVar201) * fVar164 +
                                (fVar201 * fVar164 +
                                ((fVar165 * fStack_3b4 + fVar141 * fStack_2b4) - fVar191) * fVar123)
                                * fVar123) * 3.0;
                      fVar122 = (((fVar122 - (fStack_390 * fVar166 + fStack_340 * fVar141)) *
                                  fVar164 + fVar123 * fVar203) * fVar164 +
                                (fVar203 * fVar164 +
                                ((fVar166 * fStack_3b0 + fVar141 * fStack_2b0) - fVar202) * fVar123)
                                * fVar123) * 3.0;
                      pGVar12 = (context->scene->geometries).items[local_370].ptr;
                      if ((pGVar12->mask & ray->mask) == 0) {
                        uVar57 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (uVar57 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar124 = fVar159 * local_188 +
                                  fVar160 * local_198 + fVar143 * local_1a8 + fVar161 * local_1b8;
                        fVar164 = fVar159 * fStack_184 +
                                  fVar160 * fStack_194 + fVar143 * fStack_1a4 + fVar161 * fStack_1b4
                        ;
                        fVar143 = fVar159 * fStack_180 +
                                  fVar160 * fStack_190 + fVar143 * fStack_1a0 + fVar161 * fStack_1b0
                        ;
                        local_1e8 = CONCAT44(fVar124 * fVar122 - fVar102 * fVar143,
                                             fVar143 * fVar103 - fVar122 * fVar164);
                        local_1e0 = fVar164 * fVar102 - fVar103 * fVar124;
                        local_1dc = fVar123;
                        fStack_1d8 = fVar141;
                        local_1d4 = (int)local_300;
                        local_1d0 = (int)local_370;
                        local_1cc = context->user->instID[0];
                        local_1c8 = context->user->instPrimID[0];
                        ray->tfar = fVar72;
                        local_3ec = 0xffffffff;
                        local_2e8.valid = &local_3ec;
                        local_2e8.geometryUserPtr = pGVar12->userPtr;
                        local_2e8.context = context->user;
                        local_2e8.hit = (RTCHitN *)&local_1e8;
                        local_2e8.N = 1;
                        local_2e8.ray = (RTCRayN *)ray;
                        if ((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar12->occlusionFilterN)(&local_2e8), *local_2e8.valid != 0)) {
                          p_Var59 = context->args->filter;
                          if (p_Var59 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var59)(&local_2e8);
                            }
                            p_Var59 = (RTCFilterFunctionN)local_2e8.valid;
                            if (*local_2e8.valid == 0) goto LAB_00c14db1;
                          }
                          uVar57 = CONCAT71((int7)((ulong)p_Var59 >> 8),1);
                        }
                        else {
LAB_00c14db1:
                          uVar57 = 0;
                        }
                        if ((char)uVar57 == '\0') {
                          ray->tfar = fVar101;
                        }
                      }
                      local_43c = (uint)(byte)((byte)local_43c | (byte)uVar57);
                      uVar62 = (ulong)local_43c;
                    }
                  }
                  break;
                }
                uVar57 = uVar57 - 1;
              } while (uVar57 != 0);
            }
            else {
              bVar19 = false;
            }
          }
        }
      }
    } while (bVar19);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }